

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax_x86_fma.cpp
# Opt level: O0

void ncnn::softmax(float *_ptr,int elemcount,int elempack)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [56];
  undefined1 auVar76 [24];
  undefined1 (*__b) [64];
  undefined1 auVar77 [40];
  undefined1 auVar78 [48];
  undefined1 auVar79 [24];
  undefined4 uVar80;
  undefined4 uVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined1 auVar89 [32];
  float *pfVar88;
  int in_EDX;
  int in_ESI;
  undefined1 (*in_RDI) [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  float fVar94;
  float fVar95;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar96 [32];
  __m128 _p_8;
  __m256 _p_7;
  __m512 _p_6;
  int i_2;
  float *ptr_2;
  __m128 _sum1_2;
  __m128 _sum0_2;
  __m256 _sum1_1;
  __m256 _sum0_1;
  __m256 _sum1;
  __m256 _sum0;
  float v;
  __m128 _p_5;
  __m256 _p_4;
  __m512 _p_3;
  int i_1;
  float *ptr_1;
  float sum;
  __m128 _sum;
  __m256 _sum_avx;
  __m512 _sum_avx512;
  __m128 _max1_2;
  __m128 _max0_2;
  __m256 _max1_1;
  __m256 _max0_1;
  __m256 _max1;
  __m256 _max0;
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  float max;
  __m128 _max;
  __m256 _max_avx;
  __m512 _max_avx512;
  int size;
  __m128 x32;
  __m128 x64;
  __m128 x128;
  __m256 x256;
  __m128 x32_1;
  __m128 x64_1;
  __m128 x128_1;
  __m128 x32_2;
  __m128 x64_2;
  __m512 pow2n;
  __m512 y;
  __mmask16 mask;
  __m512 one;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m256 pow2n_1;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  v4sf pow2n_2;
  v4sf y_2;
  v4sf mask_2;
  v4sf one_2;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_2;
  __m128 x32_3;
  __m128 x64_3;
  __m128 x128_2;
  __m256 x256_1;
  __m128 x32_4;
  __m128 x64_4;
  __m128 x128_3;
  __m128 x32_5;
  __m128 x64_5;
  undefined8 local_39b0;
  undefined8 uStack_39a8;
  undefined8 local_39a0;
  undefined8 uStack_3998;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  undefined8 uStack_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  int local_392c;
  undefined1 (*local_3928) [64];
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 local_3870;
  undefined8 uStack_3868;
  undefined8 local_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  undefined8 uStack_3820;
  undefined8 uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  int local_37c4;
  undefined1 (*local_37c0) [64];
  float local_37b4;
  undefined1 local_37b0 [8];
  undefined8 uStack_37a8;
  undefined1 local_37a0 [8];
  undefined8 uStack_3798;
  undefined1 auStack_3790 [8];
  undefined8 uStack_3788;
  undefined1 local_3780 [64];
  float local_372c;
  float local_3728;
  float local_3724;
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 local_3710;
  undefined8 uStack_3708;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3670;
  undefined8 uStack_3668;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 uStack_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  int local_35c4;
  undefined1 (*local_35c0) [64];
  float local_35b4;
  undefined1 local_35b0 [16];
  undefined1 local_35a0 [24];
  undefined8 uStack_3588;
  undefined1 local_3580 [64];
  int local_3514;
  int local_3510;
  undefined1 (*local_3508) [64];
  undefined1 local_3480 [64];
  undefined4 local_3404;
  undefined1 local_3400 [64];
  undefined4 local_33c0;
  undefined4 local_33b8;
  undefined4 local_33b4;
  undefined4 local_3370;
  undefined4 uStack_336c;
  undefined4 uStack_3368;
  undefined4 uStack_3364;
  undefined4 local_3354;
  float local_3350;
  float fStack_334c;
  float fStack_3348;
  float fStack_3344;
  float local_3334;
  undefined4 local_3330;
  undefined4 uStack_332c;
  undefined4 uStack_3328;
  undefined4 uStack_3324;
  undefined4 local_331c;
  undefined1 (*local_3310) [64];
  undefined1 (*local_3308) [64];
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 uStack_32e8;
  undefined8 uStack_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined8 uStack_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined1 local_3280 [32];
  undefined1 (*local_3250) [64];
  undefined1 (*local_3248) [64];
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined1 (*local_30f0) [64];
  undefined1 (*local_30e8) [64];
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 local_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 local_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 local_3090;
  undefined8 uStack_3088;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  undefined8 uStack_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 uStack_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 uStack_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 uStack_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 local_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 local_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined1 local_2b90 [16];
  undefined1 local_2b80 [16];
  undefined1 local_2b70 [16];
  undefined1 local_2b60 [24];
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 uStack_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined1 local_2b00 [32];
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined1 local_2ac0 [16];
  undefined8 local_2ab0;
  undefined8 uStack_2aa8;
  undefined1 local_2aa0 [16];
  undefined8 local_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 uStack_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined1 local_2a10 [16];
  undefined1 local_2a00 [16];
  undefined1 local_29f0 [16];
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined1 local_29c0 [16];
  undefined8 local_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 local_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined1 local_2950 [16];
  undefined1 local_2940 [16];
  undefined8 local_2930;
  undefined8 uStack_2928;
  undefined1 local_2920 [16];
  undefined8 local_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 uStack_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 uStack_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined1 local_2880 [64];
  undefined1 local_2840 [8];
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 uStack_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  ushort local_27c2;
  float local_27c0 [2];
  float afStack_27b8 [2];
  float afStack_27b0 [2];
  float afStack_27a8 [2];
  float afStack_27a0 [2];
  float afStack_2798 [2];
  float afStack_2790 [2];
  float afStack_2788 [2];
  undefined1 local_2780 [64];
  undefined1 local_2740 [16];
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 uStack_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined1 local_2700 [64];
  undefined1 local_26c0 [64];
  float local_2680 [2];
  float afStack_2678 [2];
  float afStack_2670 [2];
  float afStack_2668 [2];
  float afStack_2660 [2];
  float afStack_2658 [2];
  float afStack_2650 [2];
  float afStack_2648 [2];
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 uStack_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 uStack_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined1 (*local_2508) [64];
  float local_2500 [2];
  float afStack_24f8 [2];
  float afStack_24f0 [2];
  float afStack_24e8 [2];
  float afStack_24e0 [2];
  float afStack_24d8 [2];
  float afStack_24d0 [2];
  float afStack_24c8 [2];
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 uStack_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 uStack_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined1 local_2440 [64];
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined1 local_23a0 [8];
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined1 local_2380 [32];
  undefined4 local_2360;
  undefined4 uStack_235c;
  undefined4 uStack_2358;
  undefined4 uStack_2354;
  undefined4 uStack_2350;
  undefined4 uStack_234c;
  undefined4 uStack_2348;
  undefined4 uStack_2344;
  undefined1 local_2340 [32];
  undefined1 local_2320 [32];
  undefined1 local_2300 [8];
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined1 local_22e0 [32];
  undefined4 local_22c0;
  undefined4 uStack_22bc;
  undefined4 uStack_22b8;
  undefined4 uStack_22b4;
  undefined4 uStack_22b0;
  undefined4 uStack_22ac;
  undefined4 uStack_22a8;
  undefined4 uStack_22a4;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined1 (*local_21c8) [64];
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  float fStack_2170;
  float fStack_216c;
  float fStack_2168;
  float fStack_2164;
  float fStack_2130;
  float fStack_212c;
  float fStack_2128;
  float fStack_2124;
  float fStack_2110;
  float fStack_210c;
  float fStack_2108;
  float fStack_2104;
  float local_2100;
  float fStack_20fc;
  float fStack_20f8;
  float fStack_20f4;
  float fStack_20f0;
  float fStack_20ec;
  float fStack_20e8;
  float fStack_20e4;
  float local_20c0;
  float fStack_20bc;
  float fStack_20b8;
  float fStack_20b4;
  float fStack_20b0;
  float fStack_20ac;
  float fStack_20a8;
  float fStack_20a4;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined1 local_2060 [8];
  float fStack_2058;
  float fStack_2054;
  float fStack_2050;
  float fStack_204c;
  float fStack_2048;
  float fStack_2044;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 local_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined1 local_2010 [8];
  undefined8 uStack_2008;
  undefined1 local_2000 [16];
  undefined4 local_1ff0;
  undefined4 uStack_1fec;
  undefined4 uStack_1fe8;
  undefined4 uStack_1fe4;
  undefined1 local_1fe0 [16];
  undefined1 local_1fd0 [8];
  undefined8 uStack_1fc8;
  undefined1 local_1fc0 [8];
  undefined8 uStack_1fb8;
  undefined1 local_1fb0 [16];
  undefined4 local_1fa0;
  undefined4 uStack_1f9c;
  undefined4 uStack_1f98;
  undefined4 uStack_1f94;
  undefined8 local_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 local_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined1 (*local_1f28) [64];
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 local_1f10;
  undefined8 uStack_1f08;
  undefined4 local_1f00;
  undefined4 uStack_1efc;
  undefined4 uStack_1ef8;
  undefined4 uStack_1ef4;
  undefined8 local_1ef0;
  undefined8 uStack_1ee8;
  float local_1ee0;
  float fStack_1edc;
  float fStack_1ed8;
  float fStack_1ed4;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined1 local_1e90 [8];
  float fStack_1e88;
  float fStack_1e84;
  float fStack_1c90;
  float fStack_1c8c;
  float fStack_1c88;
  float fStack_1c84;
  float fStack_1c70;
  float fStack_1c6c;
  float fStack_1c68;
  float fStack_1c64;
  float local_1c50;
  float fStack_1c4c;
  float local_1c30;
  float fStack_1c2c;
  float fStack_1c28;
  float fStack_1c24;
  float local_1b90;
  float fStack_1b8c;
  float local_1b70;
  float fStack_1b6c;
  float fStack_1b68;
  float fStack_1b64;
  float local_1b60;
  float fStack_1b5c;
  float fStack_1b58;
  float fStack_1b54;
  float local_1b20;
  float fStack_1b1c;
  float local_1b10;
  float fStack_1b0c;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 uStack_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 uStack_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 uStack_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 uStack_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  float local_1900;
  float fStack_18fc;
  float fStack_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  float fStack_18e8;
  float local_18e0;
  float fStack_18dc;
  float fStack_18d8;
  float fStack_18d4;
  float fStack_18d0;
  float fStack_18cc;
  float fStack_18c8;
  undefined4 uStack_18c4;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 local_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 local_1890;
  undefined8 uStack_1888;
  undefined4 local_1880;
  undefined4 uStack_187c;
  undefined4 uStack_1878;
  undefined4 uStack_1874;
  undefined8 local_1870;
  undefined8 uStack_1868;
  float local_1860;
  float fStack_185c;
  float fStack_1858;
  float fStack_1854;
  float local_1850;
  float fStack_184c;
  float fStack_1848;
  float fStack_1844;
  undefined1 local_1840 [16];
  undefined1 auStack_1830 [16];
  undefined4 local_1820;
  undefined4 local_181c;
  undefined4 local_1818;
  undefined4 local_1814;
  undefined4 local_1810;
  undefined4 local_180c;
  undefined4 local_1808;
  undefined4 local_1804;
  undefined1 local_1800 [16];
  undefined1 auStack_17f0 [16];
  undefined4 local_17e0;
  undefined4 local_17dc;
  undefined4 local_17d8;
  undefined4 local_17d4;
  undefined4 local_17d0;
  undefined4 local_17cc;
  undefined4 local_17c8;
  undefined4 local_17c4;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 local_16b0;
  undefined8 uStack_16a8;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 local_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 local_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 local_15d0;
  undefined8 uStack_15c8;
  undefined4 local_15c0;
  undefined4 uStack_15bc;
  undefined4 uStack_15b8;
  undefined4 uStack_15b4;
  undefined8 local_15b0;
  undefined8 uStack_15a8;
  undefined4 local_15a0;
  undefined4 uStack_159c;
  undefined4 uStack_1598;
  undefined4 uStack_1594;
  undefined8 local_1590;
  undefined8 uStack_1588;
  undefined4 local_1580;
  undefined4 uStack_157c;
  undefined4 uStack_1578;
  undefined4 uStack_1574;
  undefined8 local_1570;
  undefined8 uStack_1568;
  undefined8 local_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 local_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 uStack_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  float local_14c0 [2];
  float afStack_14b8 [2];
  float afStack_14b0 [2];
  float afStack_14a8 [2];
  float afStack_14a0 [2];
  float afStack_1498 [2];
  float afStack_1490 [2];
  float afStack_1488 [2];
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 uStack_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 uStack_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 uStack_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 uStack_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  float local_1380 [2];
  float afStack_1378 [2];
  float afStack_1370 [2];
  float afStack_1368 [2];
  float afStack_1360 [2];
  float afStack_1358 [2];
  float afStack_1350 [2];
  float afStack_1348 [2];
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 uStack_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 uStack_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  float local_12c0 [2];
  float afStack_12b8 [2];
  float afStack_12b0 [2];
  float afStack_12a8 [2];
  float afStack_12a0 [2];
  float afStack_1298 [2];
  float afStack_1290 [2];
  float afStack_1288 [2];
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 uStack_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 uStack_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  float local_1200 [2];
  float afStack_11f8 [2];
  float afStack_11f0 [2];
  float afStack_11e8 [2];
  float afStack_11e0 [2];
  float afStack_11d8 [2];
  float afStack_11d0 [2];
  float afStack_11c8 [2];
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 uStack_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 uStack_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  float local_1140 [2];
  float afStack_1138 [2];
  float afStack_1130 [2];
  float afStack_1128 [2];
  float afStack_1120 [2];
  float afStack_1118 [2];
  float afStack_1110 [2];
  float afStack_1108 [2];
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 uStack_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 uStack_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  float local_1080 [2];
  float afStack_1078 [2];
  float afStack_1070 [2];
  float afStack_1068 [2];
  float afStack_1060 [2];
  float afStack_1058 [2];
  float afStack_1050 [2];
  float afStack_1048 [2];
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 uStack_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  float local_1000 [2];
  float afStack_ff8 [2];
  float afStack_ff0 [2];
  float afStack_fe8 [2];
  float afStack_fe0 [2];
  float afStack_fd8 [2];
  float afStack_fd0 [2];
  float afStack_fc8 [2];
  float local_fc0 [2];
  float afStack_fb8 [2];
  float afStack_fb0 [2];
  float afStack_fa8 [2];
  float afStack_fa0 [2];
  float afStack_f98 [2];
  float afStack_f90 [2];
  float afStack_f88 [2];
  float local_f80 [2];
  float afStack_f78 [2];
  float afStack_f70 [2];
  float afStack_f68 [2];
  float afStack_f60 [2];
  float afStack_f58 [2];
  float afStack_f50 [2];
  float afStack_f48 [2];
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 uStack_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  float local_f00 [2];
  float afStack_ef8 [2];
  float afStack_ef0 [2];
  float afStack_ee8 [2];
  float afStack_ee0 [2];
  float afStack_ed8 [2];
  float afStack_ed0 [2];
  float afStack_ec8 [2];
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  ushort local_e42;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 uStack_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  float local_e00 [2];
  float afStack_df8 [2];
  float afStack_df0 [2];
  float afStack_de8 [2];
  float afStack_de0 [2];
  float afStack_dd8 [2];
  float afStack_dd0 [2];
  float afStack_dc8 [2];
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 uStack_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 uStack_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  float local_d40 [2];
  float afStack_d38 [2];
  float afStack_d30 [2];
  float afStack_d28 [2];
  float afStack_d20 [2];
  float afStack_d18 [2];
  float afStack_d10 [2];
  float afStack_d08 [2];
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 uStack_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 uStack_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  float local_c80 [2];
  float afStack_c78 [2];
  float afStack_c70 [2];
  float afStack_c68 [2];
  float afStack_c60 [2];
  float afStack_c58 [2];
  float afStack_c50 [2];
  float afStack_c48 [2];
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 uStack_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 uStack_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined1 local_bc0 [64];
  undefined1 local_b80 [64];
  undefined4 local_b04;
  undefined1 local_b00 [64];
  undefined1 local_ac0 [64];
  undefined1 local_a80 [64];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined4 local_a00;
  undefined4 uStack_9fc;
  undefined4 uStack_9f8;
  undefined4 uStack_9f4;
  undefined4 uStack_9f0;
  undefined4 uStack_9ec;
  undefined4 uStack_9e8;
  undefined4 uStack_9e4;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined1 *local_9a8;
  undefined1 *local_9a0;
  undefined1 *local_998;
  float *local_990;
  undefined1 *local_988;
  undefined1 *local_980;
  float *local_978;
  undefined1 *local_970;
  undefined1 *local_968;
  float *local_960;
  undefined1 *local_958;
  undefined1 *local_950;
  float *local_948;
  undefined1 *local_940;
  undefined1 *local_938;
  float *local_930;
  undefined1 *local_928;
  undefined1 *local_920;
  float *local_918;
  float *local_910;
  undefined1 *local_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined1 *local_8b0;
  float *local_8a8;
  undefined1 *local_8a0;
  undefined1 *local_898;
  float *local_890;
  undefined1 *local_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined4 local_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  float local_7c0 [2];
  float afStack_7b8 [2];
  float afStack_7b0 [2];
  float afStack_7a8 [2];
  float local_7a0 [2];
  float afStack_798 [2];
  float afStack_790 [2];
  float afStack_788 [2];
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float local_760 [2];
  float afStack_758 [2];
  float afStack_750 [2];
  float afStack_748 [2];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  float local_700 [2];
  float afStack_6f8 [2];
  float afStack_6f0 [2];
  float afStack_6e8 [2];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_6a0 [2];
  float afStack_698 [2];
  float afStack_690 [2];
  float afStack_688 [2];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  float local_640 [2];
  float afStack_638 [2];
  float afStack_630 [2];
  float afStack_628 [2];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5e0 [2];
  float afStack_5d8 [2];
  float afStack_5d0 [2];
  float afStack_5c8 [2];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  float local_500 [2];
  float afStack_4f8 [2];
  float afStack_4f0 [2];
  float afStack_4e8 [2];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  float local_4a0 [2];
  float afStack_498 [2];
  float afStack_490 [2];
  float afStack_488 [2];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined4 local_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [16];
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined1 *local_340;
  float *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  float *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  float *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  float *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  float *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  float *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  float *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined4 local_254;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  float local_220 [2];
  float afStack_218 [2];
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1f0 [2];
  float afStack_1e8 [2];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1d0 [2];
  float afStack_1c8 [2];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_1a0 [2];
  float afStack_198 [2];
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  float local_170 [2];
  float afStack_168 [2];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  float local_140 [2];
  float afStack_138 [2];
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  float local_110 [2];
  float afStack_108 [2];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  
  local_3514 = in_ESI * in_EDX;
  local_33c0 = 0xff7fffff;
  local_3400 = vbroadcastss_avx512f(ZEXT416(0xff7fffff));
  local_33b4 = 0xff7fffff;
  local_1804 = 0xff7fffff;
  local_1808 = 0xff7fffff;
  local_180c = 0xff7fffff;
  local_1810 = 0xff7fffff;
  local_1814 = 0xff7fffff;
  local_1818 = 0xff7fffff;
  local_181c = 0xff7fffff;
  local_1820 = 0xff7fffff;
  auVar17 = vinsertps_avx(ZEXT416(0xff7fffff),ZEXT416(0xff7fffff),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(0xff7fffff),0x20);
  local_1840 = vinsertps_avx(auVar17,ZEXT416(0xff7fffff),0x30);
  auVar17 = vinsertps_avx(ZEXT416(0xff7fffff),ZEXT416(0xff7fffff),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(0xff7fffff),0x20);
  auStack_1830 = vinsertps_avx(auVar17,ZEXT416(0xff7fffff),0x30);
  local_35a0._16_8_ = auStack_1830._0_8_;
  local_35a0._0_16_ = local_1840;
  uStack_3588 = auStack_1830._8_8_;
  local_331c = 0xff7fffff;
  local_3330 = 0xff7fffff;
  uStack_332c = 0xff7fffff;
  uStack_3328 = 0xff7fffff;
  uStack_3324 = 0xff7fffff;
  local_35b0._8_8_ = 0xff7fffffff7fffff;
  local_35b0._0_8_ = 0xff7fffffff7fffff;
  local_35b4 = -3.4028235e+38;
  local_35c0 = in_RDI;
  local_3580 = local_3400;
  for (local_35c4 = 0; local_35c4 + 0xf < local_3514; local_35c4 = local_35c4 + 0x10) {
    local_3308 = local_35c0;
    local_3640 = *(undefined8 *)*local_35c0;
    uStack_3638 = *(undefined8 *)(*local_35c0 + 8);
    uStack_3630 = *(undefined8 *)(*local_35c0 + 0x10);
    uStack_3628 = *(undefined8 *)(*local_35c0 + 0x18);
    uStack_3620 = *(undefined8 *)(*local_35c0 + 0x20);
    uStack_3618 = *(undefined8 *)(*local_35c0 + 0x28);
    uStack_3610 = *(undefined8 *)(*local_35c0 + 0x30);
    uStack_3608 = *(undefined8 *)(*local_35c0 + 0x38);
    local_32c0 = local_3580._0_8_;
    uStack_32b8 = local_3580._8_8_;
    uStack_32b0 = local_3580._16_8_;
    uStack_32a8 = local_3580._24_8_;
    uStack_32a0 = local_3580._32_8_;
    uStack_3298 = local_3580._40_8_;
    uStack_3290 = local_3580._48_8_;
    uStack_3288 = local_3580._56_8_;
    local_3580 = vmaxps_avx512f(local_3580,*local_35c0);
    local_35c0 = local_35c0 + 1;
    local_3300 = local_3640;
    uStack_32f8 = uStack_3638;
    uStack_32f0 = uStack_3630;
    uStack_32e8 = uStack_3628;
    uStack_32e0 = uStack_3620;
    uStack_32d8 = uStack_3618;
    uStack_32d0 = uStack_3610;
    uStack_32c8 = uStack_3608;
  }
  for (; local_35c4 + 7 < local_3514; local_35c4 = local_35c4 + 8) {
    local_3248 = local_35c0;
    local_3660 = *(undefined8 *)*local_35c0;
    uStack_3658 = *(undefined8 *)(*local_35c0 + 8);
    uStack_3650 = *(undefined8 *)(*local_35c0 + 0x10);
    uStack_3648 = *(undefined8 *)(*local_35c0 + 0x18);
    local_3120 = local_35a0._0_8_;
    uStack_3118 = local_35a0._8_8_;
    uStack_3110 = local_35a0._16_8_;
    uStack_3108 = uStack_3588;
    _local_35a0 = vmaxps_avx(_local_35a0,*(undefined1 (*) [32])*local_35c0);
    local_35c0 = (undefined1 (*) [64])(*local_35c0 + 0x20);
    local_3140 = local_3660;
    uStack_3138 = uStack_3658;
    uStack_3130 = uStack_3650;
    uStack_3128 = uStack_3648;
  }
  for (; local_3510 = in_EDX, local_3508 = in_RDI, local_35c4 + 3 < local_3514;
      local_35c4 = local_35c4 + 4) {
    local_30e8 = local_35c0;
    local_3670 = *(undefined8 *)*local_35c0;
    uStack_3668 = *(undefined8 *)(*local_35c0 + 8);
    local_3090 = local_35b0._0_8_;
    uStack_3088 = local_35b0._8_8_;
    local_35b0 = vmaxps_avx(local_35b0,*(undefined1 (*) [16])*local_35c0);
    local_35c0 = (undefined1 (*) [64])(*local_35c0 + 0x10);
    local_30a0 = local_3670;
    uStack_3098 = uStack_3668;
  }
  for (; __b = local_35c0, local_35c4 < local_3514; local_35c4 = local_35c4 + 1) {
    local_35c0 = (undefined1 (*) [64])(*local_35c0 + 4);
    pfVar88 = std::max<float>(&local_35b4,(float *)__b);
    local_35b4 = *pfVar88;
  }
  if (local_3510 == 8) {
    local_2fc0 = local_3580._0_8_;
    uStack_2fb8 = local_3580._8_8_;
    uStack_2fb0 = local_3580._16_8_;
    uStack_2fa8 = local_3580._24_8_;
    uStack_2fa0 = local_3580._32_8_;
    uStack_2f98 = local_3580._40_8_;
    uStack_2f90 = local_3580._48_8_;
    uStack_2f88 = local_3580._56_8_;
    local_36a0 = local_3580._0_8_;
    uStack_3698 = local_3580._8_8_;
    uStack_3690 = local_3580._16_8_;
    uStack_3688 = local_3580._24_8_;
    local_2e40 = local_3580._0_8_;
    uStack_2e38 = local_3580._8_8_;
    uStack_2e30 = local_3580._16_8_;
    uStack_2e28 = local_3580._24_8_;
    uStack_2e20 = local_3580._32_8_;
    uStack_2e18 = local_3580._40_8_;
    uStack_2e10 = local_3580._48_8_;
    uStack_2e08 = local_3580._56_8_;
    local_2f20 = local_3580._32_8_;
    uStack_2f18 = local_3580._40_8_;
    uStack_2f10 = local_3580._48_8_;
    uStack_2f08 = local_3580._56_8_;
    local_36c0 = local_3580._32_8_;
    uStack_36b8 = local_3580._40_8_;
    uStack_36b0 = local_3580._48_8_;
    uStack_36a8 = local_3580._56_8_;
    local_3160 = local_35a0._0_8_;
    uStack_3158 = local_35a0._8_8_;
    uStack_3150 = local_35a0._16_8_;
    uStack_3148 = uStack_3588;
    local_3180 = local_3580._0_8_;
    uStack_3178 = local_3580._8_8_;
    uStack_3170 = local_3580._16_8_;
    uStack_3168 = local_3580._24_8_;
    auVar89 = vmaxps_avx(_local_35a0,local_3580._0_32_);
    local_35a0._0_8_ = auVar89._0_8_;
    local_35a0._8_8_ = auVar89._8_8_;
    local_35a0._16_8_ = auVar89._16_8_;
    uStack_3588 = auVar89._24_8_;
    local_31a0 = local_35a0._0_8_;
    uStack_3198 = local_35a0._8_8_;
    uStack_3190 = local_35a0._16_8_;
    uStack_3188 = uStack_3588;
    local_31c0 = local_3580._32_8_;
    uStack_31b8 = local_3580._40_8_;
    uStack_31b0 = local_3580._48_8_;
    uStack_31a8 = local_3580._56_8_;
    _local_35a0 = vmaxps_avx(auVar89,local_3580._32_32_);
    local_2c80 = local_35a0._0_8_;
    uStack_2c78 = local_35a0._8_8_;
    uStack_2c70 = local_35a0._16_8_;
    uStack_2c68 = uStack_3588;
    local_2ca0 = local_35a0._0_8_;
    uStack_2c98 = local_35a0._8_8_;
    uStack_2c90 = local_35a0._16_8_;
    uStack_2c88 = uStack_3588;
    local_1780 = local_35a0._0_8_;
    uStack_1778 = local_35a0._8_8_;
    uStack_1770 = local_35a0._16_8_;
    uStack_1768 = uStack_3588;
    local_3580 = vinsertf64x4_avx512f(ZEXT3264(_local_35a0),_local_35a0,1);
  }
  if (local_3510 == 4) {
    local_3000 = local_3580._0_8_;
    uStack_2ff8 = local_3580._8_8_;
    uStack_2ff0 = local_3580._16_8_;
    uStack_2fe8 = local_3580._24_8_;
    uStack_2fe0 = local_3580._32_8_;
    uStack_2fd8 = local_3580._40_8_;
    uStack_2fd0 = local_3580._48_8_;
    uStack_2fc8 = local_3580._56_8_;
    local_36e0 = local_3580._0_8_;
    uStack_36d8 = local_3580._8_8_;
    uStack_36d0 = local_3580._16_8_;
    uStack_36c8 = local_3580._24_8_;
    local_2e80 = local_3580._0_8_;
    uStack_2e78 = local_3580._8_8_;
    uStack_2e70 = local_3580._16_8_;
    uStack_2e68 = local_3580._24_8_;
    uStack_2e60 = local_3580._32_8_;
    uStack_2e58 = local_3580._40_8_;
    uStack_2e50 = local_3580._48_8_;
    uStack_2e48 = local_3580._56_8_;
    local_2f40 = local_3580._32_8_;
    uStack_2f38 = local_3580._40_8_;
    uStack_2f30 = local_3580._48_8_;
    uStack_2f28 = local_3580._56_8_;
    local_3700 = local_3580._32_8_;
    uStack_36f8 = local_3580._40_8_;
    uStack_36f0 = local_3580._48_8_;
    uStack_36e8 = local_3580._56_8_;
    local_31e0 = local_35a0._0_8_;
    uStack_31d8 = local_35a0._8_8_;
    uStack_31d0 = local_35a0._16_8_;
    uStack_31c8 = uStack_3588;
    local_3200 = local_3580._0_8_;
    uStack_31f8 = local_3580._8_8_;
    uStack_31f0 = local_3580._16_8_;
    uStack_31e8 = local_3580._24_8_;
    auVar89 = vmaxps_avx(_local_35a0,local_3580._0_32_);
    local_35a0._0_8_ = auVar89._0_8_;
    local_35a0._8_8_ = auVar89._8_8_;
    local_35a0._16_8_ = auVar89._16_8_;
    uStack_3588 = auVar89._24_8_;
    local_3220 = local_35a0._0_8_;
    uStack_3218 = local_35a0._8_8_;
    uStack_3210 = local_35a0._16_8_;
    uStack_3208 = uStack_3588;
    local_3240 = local_3580._32_8_;
    uStack_3238 = local_3580._40_8_;
    uStack_3230 = local_3580._48_8_;
    uStack_3228 = local_3580._56_8_;
    auVar89 = vmaxps_avx(auVar89,local_3580._32_32_);
    local_35a0._0_8_ = auVar89._0_8_;
    local_35a0._8_8_ = auVar89._8_8_;
    local_35a0._16_8_ = auVar89._16_8_;
    uStack_3588 = auVar89._24_8_;
    local_2c40 = local_35a0._0_8_;
    uStack_2c38 = local_35a0._8_8_;
    uStack_2c30 = local_35a0._16_8_;
    uStack_2c28 = uStack_3588;
    uStack_3708 = uStack_3588;
    local_3710 = local_35a0._16_8_;
    stack0xffffffffffffca70 = auVar89._16_16_;
    local_30b0 = local_35b0._0_8_;
    uStack_30a8 = local_35b0._8_8_;
    auVar17 = vmaxps_avx(local_35b0,stack0xffffffffffffca70);
    local_35b0._0_8_ = auVar17._0_8_;
    local_35b0._8_8_ = auVar17._8_8_;
    local_30d0 = local_35b0._0_8_;
    uStack_30c8 = local_35b0._8_8_;
    local_30e0 = local_3720;
    uStack_30d8 = uStack_3718;
    auVar16._8_8_ = uStack_3718;
    auVar16._0_8_ = local_3720;
    local_35b0 = vmaxps_avx(auVar17,auVar16);
    local_2ba0 = local_35b0._0_8_;
    uStack_2b98 = local_35b0._8_8_;
    local_2bb0 = local_35b0._0_8_;
    uStack_2ba8 = local_35b0._8_8_;
    local_16c0 = local_35b0._0_8_;
    uStack_16b8 = local_35b0._8_8_;
    local_35a0._0_16_ = auVar89._0_16_;
    local_35a0._16_8_ = local_35b0._0_8_;
    uStack_3588 = local_35b0._8_8_;
    local_35a0._0_16_ = local_35b0;
    local_2cc0 = local_35b0._0_8_;
    uStack_2cb8 = local_35b0._8_8_;
    uStack_2cb0 = local_35b0._0_8_;
    uStack_2ca8 = local_35b0._8_8_;
    local_2ce0 = local_35b0._0_8_;
    uStack_2cd8 = local_35b0._8_8_;
    uStack_2cd0 = local_35b0._0_8_;
    uStack_2cc8 = local_35b0._8_8_;
    local_1760 = local_35b0._0_8_;
    uStack_1758 = local_35b0._8_8_;
    uStack_1750 = local_35b0._0_8_;
    uStack_1748 = local_35b0._8_8_;
    auVar89._16_8_ = local_35b0._0_8_;
    auVar89._0_16_ = local_35b0;
    auVar89._24_8_ = local_35b0._8_8_;
    local_3580 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(local_35b0._8_8_,
                                               CONCAT816(local_35b0._0_8_,local_35b0))),auVar89,1);
    local_30c0 = local_3710;
    uStack_30b8 = uStack_3708;
  }
  if (local_3510 == 1) {
    local_2b40 = local_3580._0_8_;
    uStack_2b38 = local_3580._8_8_;
    uStack_2b30 = local_3580._16_8_;
    uStack_2b28 = local_3580._24_8_;
    uStack_2b20 = local_3580._32_8_;
    uStack_2b18 = local_3580._40_8_;
    uStack_2b10 = local_3580._48_8_;
    uStack_2b08 = local_3580._56_8_;
    local_2a80 = local_3580._0_8_;
    uStack_2a78 = local_3580._8_8_;
    uStack_2a70 = local_3580._16_8_;
    uStack_2a68 = local_3580._24_8_;
    uStack_2a60 = local_3580._32_8_;
    uStack_2a58 = local_3580._40_8_;
    uStack_2a50 = local_3580._48_8_;
    uStack_2a48 = local_3580._56_8_;
    local_2ae0 = local_3580._0_8_;
    uStack_2ad8 = local_3580._8_8_;
    uStack_2ad0 = local_3580._16_8_;
    uStack_2ac8 = local_3580._24_8_;
    local_3280 = vextractf64x4_avx512f(local_3580,1);
    _local_2b60 = vmaxps_avx(local_3580._0_32_,local_2b00);
    local_2a40 = local_2b60._0_8_;
    uStack_2a38 = local_2b60._8_8_;
    uStack_2a30 = local_2b60._16_8_;
    uStack_2a28 = uStack_2b48;
    uStack_2a88 = uStack_2b48;
    local_2a90 = local_2b60._16_8_;
    local_2b70 = vmaxps_avx(stack0xffffffffffffd4b0,local_2aa0);
    local_15d0 = local_2b70._0_8_;
    uStack_15c8 = local_2b70._8_8_;
    local_15e0 = local_2b70._0_8_;
    uStack_15d8 = local_2b70._8_8_;
    local_2ac0 = vunpckhpd_avx(local_2b70,local_2b70);
    local_2ab0 = local_2b70._0_8_;
    uStack_2aa8 = local_2b70._8_8_;
    local_2b80 = vmaxps_avx(local_2b70,local_2ac0);
    local_1570 = local_2b80._0_8_;
    uStack_1568 = local_2b80._8_8_;
    local_1580 = local_2b80._4_4_;
    uStack_157c = local_2b80._4_4_;
    uStack_1578 = local_2b80._4_4_;
    uStack_1574 = local_2b80._4_4_;
    auVar36._4_4_ = local_2b80._4_4_;
    auVar36._0_4_ = local_2b80._4_4_;
    auVar36._8_4_ = local_2b80._4_4_;
    auVar36._12_4_ = local_2b80._4_4_;
    local_2b90 = vmaxss_avx(local_2b80,auVar36);
    local_1510 = local_2b90._0_8_;
    uVar21 = local_1510;
    uStack_1508 = local_2b90._8_8_;
    local_1510._0_4_ = local_2b90._0_4_;
    local_3724 = (float)local_1510;
    local_1510 = uVar21;
    pfVar88 = std::max<float>(&local_35b4,&local_3724);
    local_35b4 = *pfVar88;
    local_29e0 = local_35a0._0_8_;
    uStack_29d8 = local_35a0._8_8_;
    uStack_29d0 = local_35a0._16_8_;
    uStack_29c8 = uStack_3588;
    local_2980 = local_35a0._0_8_;
    uStack_2978 = local_35a0._8_8_;
    uStack_2970 = local_35a0._16_8_;
    uStack_2968 = uStack_3588;
    local_2990 = local_35a0._16_8_;
    uStack_2988 = uStack_3588;
    local_29a0 = local_35a0._0_8_;
    uStack_2998 = local_35a0._8_8_;
    local_29f0 = vmaxps_avx(local_35a0._16_16_,local_35a0._0_16_);
    local_15f0 = local_29f0._0_8_;
    uStack_15e8 = local_29f0._8_8_;
    local_1600 = local_29f0._0_8_;
    uStack_15f8 = local_29f0._8_8_;
    local_29c0 = vunpckhpd_avx(local_29f0,local_29f0);
    local_29b0 = local_29f0._0_8_;
    uStack_29a8 = local_29f0._8_8_;
    local_2a00 = vmaxps_avx(local_29f0,local_29c0);
    local_1590 = local_2a00._0_8_;
    uStack_1588 = local_2a00._8_8_;
    local_15a0 = local_2a00._4_4_;
    uStack_159c = local_2a00._4_4_;
    uStack_1598 = local_2a00._4_4_;
    uStack_1594 = local_2a00._4_4_;
    auVar18._4_4_ = local_2a00._4_4_;
    auVar18._0_4_ = local_2a00._4_4_;
    auVar18._8_4_ = local_2a00._4_4_;
    auVar18._12_4_ = local_2a00._4_4_;
    local_2a10 = vmaxss_avx(local_2a00,auVar18);
    local_1520 = local_2a10._0_8_;
    uVar21 = local_1520;
    uStack_1518 = local_2a10._8_8_;
    local_1520._0_4_ = local_2a10._0_4_;
    local_3728 = (float)local_1520;
    local_1520 = uVar21;
    pfVar88 = std::max<float>(&local_35b4,&local_3728);
    local_35b4 = *pfVar88;
    local_2930 = local_35b0._0_8_;
    uStack_2928 = local_35b0._8_8_;
    local_1610 = local_35b0._0_8_;
    uStack_1608 = local_35b0._8_8_;
    local_1620 = local_35b0._0_8_;
    uStack_1618 = local_35b0._8_8_;
    local_2920 = vunpckhpd_avx(local_35b0,local_35b0);
    local_2910 = local_35b0._0_8_;
    uStack_2908 = local_35b0._8_8_;
    local_2940 = vmaxps_avx(local_35b0,local_2920);
    local_15b0 = local_2940._0_8_;
    uStack_15a8 = local_2940._8_8_;
    local_15c0 = local_2940._4_4_;
    uStack_15bc = local_2940._4_4_;
    uStack_15b8 = local_2940._4_4_;
    uStack_15b4 = local_2940._4_4_;
    auVar17._4_4_ = local_2940._4_4_;
    auVar17._0_4_ = local_2940._4_4_;
    auVar17._8_4_ = local_2940._4_4_;
    auVar17._12_4_ = local_2940._4_4_;
    local_2950 = vmaxss_avx(local_2940,auVar17);
    local_1530 = local_2950._0_8_;
    uVar21 = local_1530;
    uStack_1528 = local_2950._8_8_;
    local_1530._0_4_ = local_2950._0_4_;
    local_372c = (float)local_1530;
    local_1530 = uVar21;
    pfVar88 = std::max<float>(&local_35b4,&local_372c);
    local_35b4 = *pfVar88;
    local_2d20 = CONCAT44(local_35b4,local_35b4);
    uStack_2d18 = CONCAT44(local_35b4,local_35b4);
    local_35b0._8_8_ = uStack_2d18;
    local_35b0._0_8_ = local_2d20;
    local_35a0._16_8_ = local_2d20;
    uStack_3588 = uStack_2d18;
    local_35a0._8_8_ = uStack_2d18;
    local_35a0._0_8_ = local_2d20;
    auVar19._8_8_ = uStack_2d18;
    auVar19._0_8_ = local_2d20;
    auVar19._16_8_ = local_2d20;
    auVar19._24_8_ = uStack_2d18;
    local_3580 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(uStack_2d18,
                                               CONCAT816(local_2d20,CONCAT88(uStack_2d18,local_2d20)
                                                        ))),auVar19,1);
    local_3350 = local_35b4;
    fStack_334c = local_35b4;
    fStack_3348 = local_35b4;
    fStack_3344 = local_35b4;
    local_3334 = local_35b4;
    uStack_2d10 = local_2d20;
    uStack_2d08 = uStack_2d18;
    local_2d00 = local_2d20;
    uStack_2cf8 = uStack_2d18;
    uStack_2cf0 = local_2d20;
    uStack_2ce8 = uStack_2d18;
    local_2bd0 = local_2d20;
    uStack_2bc8 = uStack_2d18;
    local_2bc0 = local_2d20;
    uStack_2bb8 = uStack_2d18;
    local_1740 = local_2d20;
    uStack_1738 = uStack_2d18;
    uStack_1730 = local_2d20;
    uStack_1728 = uStack_2d18;
    local_16b0 = local_2d20;
    uStack_16a8 = uStack_2d18;
  }
  local_3404 = 0;
  local_3480 = vbroadcastss_avx512f(ZEXT416(0));
  local_33b8 = 0;
  local_17c4 = 0;
  local_17c8 = 0;
  local_17cc = 0;
  local_17d0 = 0;
  local_17d4 = 0;
  local_17d8 = 0;
  local_17dc = 0;
  local_17e0 = 0;
  auVar17 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(0),0x20);
  local_1800 = vinsertps_avx(auVar17,ZEXT416(0),0x30);
  auVar17 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(0),0x20);
  auStack_17f0 = vinsertps_avx(auVar17,ZEXT416(0),0x30);
  auStack_3790 = (undefined1  [8])auStack_17f0._0_8_;
  _local_37a0 = local_1800;
  uStack_3788 = auStack_17f0._8_8_;
  local_3354 = 0;
  local_3370 = 0;
  uStack_336c = 0;
  uStack_3368 = 0;
  uStack_3364 = 0;
  _local_37b0 = ZEXT816(0);
  local_37b4 = 0.0;
  local_37c0 = local_3508;
  local_3780 = local_3480;
  for (local_37c4 = 0; local_37c4 + 0xf < local_3514; local_37c4 = local_37c4 + 0x10) {
    local_3310 = local_37c0;
    auVar75 = *(undefined1 (*) [56])*local_37c0;
    uStack_2888 = *(undefined8 *)(*local_37c0 + 0x38);
    local_3840 = auVar75._0_8_;
    local_28c0 = local_3840;
    uStack_3838 = auVar75._8_8_;
    uStack_28b8 = uStack_3838;
    uStack_3830 = auVar75._16_8_;
    uStack_28b0 = uStack_3830;
    uStack_3828 = auVar75._24_8_;
    uStack_28a8 = uStack_3828;
    uStack_3820 = auVar75._32_8_;
    uStack_28a0 = uStack_3820;
    uStack_3818 = auVar75._40_8_;
    uStack_2898 = uStack_3818;
    uStack_3810 = auVar75._48_8_;
    uStack_2890 = uStack_3810;
    local_2900 = local_3580._0_8_;
    uStack_28f8 = local_3580._8_8_;
    uStack_28f0 = local_3580._16_8_;
    uStack_28e8 = local_3580._24_8_;
    uStack_28e0 = local_3580._32_8_;
    uStack_28d8 = local_3580._40_8_;
    uStack_28d0 = local_3580._48_8_;
    uStack_28c8 = local_3580._56_8_;
    auVar90 = vsubps_avx512f(*local_37c0,local_3580);
    local_3840 = auVar90._0_8_;
    uStack_3838 = auVar90._8_8_;
    uStack_3830 = auVar90._16_8_;
    uStack_3828 = auVar90._24_8_;
    uStack_3820 = auVar90._32_8_;
    uStack_3818 = auVar90._40_8_;
    uStack_3810 = auVar90._48_8_;
    uStack_3808 = auVar90._56_8_;
    local_1500 = 0;
    uStack_14f8 = 0;
    uStack_14f0 = 0;
    uStack_14e8 = 0;
    uStack_14e0 = 0;
    uStack_14d8 = 0;
    uStack_14d0 = 0;
    uStack_14c8 = 0;
    local_27c0[0] = 1.0;
    local_27c0[1] = 1.0;
    afStack_27b8[0] = 1.0;
    afStack_27b8[1] = 1.0;
    afStack_27b0[0] = 1.0;
    afStack_27b0[1] = 1.0;
    afStack_27a8[0] = 1.0;
    afStack_27a8[1] = 1.0;
    afStack_27a0[0] = 1.0;
    afStack_27a0[1] = 1.0;
    afStack_2798[0] = 1.0;
    afStack_2798[1] = 1.0;
    afStack_2790[0] = 1.0;
    afStack_2790[1] = 1.0;
    afStack_2788[0] = 1.0;
    afStack_2788[1] = 1.0;
    local_1480 = local_3840;
    uStack_1478 = uStack_3838;
    uStack_1470 = uStack_3830;
    uStack_1468 = uStack_3828;
    uStack_1460 = uStack_3820;
    uStack_1458 = uStack_3818;
    uStack_1450 = uStack_3810;
    uStack_1448 = uStack_3808;
    local_14c0[0] = 88.37626;
    local_14c0[1] = 88.37626;
    afStack_14b8[0] = 88.37626;
    afStack_14b8[1] = 88.37626;
    afStack_14b0[0] = 88.37626;
    afStack_14b0[1] = 88.37626;
    afStack_14a8[0] = 88.37626;
    afStack_14a8[1] = 88.37626;
    afStack_14a0[0] = 88.37626;
    afStack_14a0[1] = 88.37626;
    afStack_1498[0] = 88.37626;
    afStack_1498[1] = 88.37626;
    afStack_1490[0] = 88.37626;
    afStack_1490[1] = 88.37626;
    afStack_1488[0] = 88.37626;
    afStack_1488[1] = 88.37626;
    auVar92._8_4_ = 88.37626;
    auVar92._12_4_ = 88.37626;
    auVar92._0_4_ = 88.37626;
    auVar92._4_4_ = 88.37626;
    auVar92._16_4_ = 88.37626;
    auVar92._20_4_ = 88.37626;
    auVar92._24_4_ = 88.37626;
    auVar92._28_4_ = 88.37626;
    auVar92._32_4_ = 88.37626;
    auVar92._36_4_ = 88.37626;
    auVar92._40_4_ = 88.37626;
    auVar92._44_4_ = 88.37626;
    auVar92._48_4_ = 88.37626;
    auVar92._52_4_ = 88.37626;
    auVar92._56_4_ = 88.37626;
    auVar92._60_4_ = 88.37626;
    auVar91 = vminps_avx512f(auVar90,auVar92);
    local_26c0._0_8_ = auVar91._0_8_;
    local_2640 = local_26c0._0_8_;
    local_26c0._8_8_ = auVar91._8_8_;
    uStack_2638 = local_26c0._8_8_;
    local_26c0._16_8_ = auVar91._16_8_;
    uStack_2630 = local_26c0._16_8_;
    local_26c0._24_8_ = auVar91._24_8_;
    uStack_2628 = local_26c0._24_8_;
    local_26c0._32_8_ = auVar91._32_8_;
    uStack_2620 = local_26c0._32_8_;
    local_26c0._40_8_ = auVar91._40_8_;
    uStack_2618 = local_26c0._40_8_;
    local_26c0._48_8_ = auVar91._48_8_;
    uStack_2610 = local_26c0._48_8_;
    local_26c0._56_8_ = auVar91._56_8_;
    uStack_2608 = local_26c0._56_8_;
    local_2680[0] = -88.37626;
    local_2680[1] = -88.37626;
    afStack_2678[0] = -88.37626;
    afStack_2678[1] = -88.37626;
    afStack_2670[0] = -88.37626;
    afStack_2670[1] = -88.37626;
    afStack_2668[0] = -88.37626;
    afStack_2668[1] = -88.37626;
    afStack_2660[0] = -88.37626;
    afStack_2660[1] = -88.37626;
    afStack_2658[0] = -88.37626;
    afStack_2658[1] = -88.37626;
    afStack_2650[0] = -88.37626;
    afStack_2650[1] = -88.37626;
    afStack_2648[0] = -88.37626;
    afStack_2648[1] = -88.37626;
    auVar90._8_4_ = -88.37626;
    auVar90._12_4_ = -88.37626;
    auVar90._0_4_ = -88.37626;
    auVar90._4_4_ = -88.37626;
    auVar90._16_4_ = -88.37626;
    auVar90._20_4_ = -88.37626;
    auVar90._24_4_ = -88.37626;
    auVar90._28_4_ = -88.37626;
    auVar90._32_4_ = -88.37626;
    auVar90._36_4_ = -88.37626;
    auVar90._40_4_ = -88.37626;
    auVar90._44_4_ = -88.37626;
    auVar90._48_4_ = -88.37626;
    auVar90._52_4_ = -88.37626;
    auVar90._56_4_ = -88.37626;
    auVar90._60_4_ = -88.37626;
    auVar90 = vmaxps_avx512f(auVar91,auVar90);
    local_26c0._0_8_ = auVar90._0_8_;
    local_f40 = local_26c0._0_8_;
    local_26c0._8_8_ = auVar90._8_8_;
    uStack_f38 = local_26c0._8_8_;
    local_26c0._16_8_ = auVar90._16_8_;
    uStack_f30 = local_26c0._16_8_;
    local_26c0._24_8_ = auVar90._24_8_;
    uStack_f28 = local_26c0._24_8_;
    local_26c0._32_8_ = auVar90._32_8_;
    uStack_f20 = local_26c0._32_8_;
    local_26c0._40_8_ = auVar90._40_8_;
    uStack_f18 = local_26c0._40_8_;
    local_26c0._48_8_ = auVar90._48_8_;
    uStack_f10 = local_26c0._48_8_;
    local_26c0._56_8_ = auVar90._56_8_;
    uStack_f08 = local_26c0._56_8_;
    local_f80[0] = 1.442695;
    local_f80[1] = 1.442695;
    afStack_f78[0] = 1.442695;
    afStack_f78[1] = 1.442695;
    afStack_f70[0] = 1.442695;
    afStack_f70[1] = 1.442695;
    afStack_f68[0] = 1.442695;
    afStack_f68[1] = 1.442695;
    afStack_f60[0] = 1.442695;
    afStack_f60[1] = 1.442695;
    afStack_f58[0] = 1.442695;
    afStack_f58[1] = 1.442695;
    afStack_f50[0] = 1.442695;
    afStack_f50[1] = 1.442695;
    afStack_f48[0] = 1.442695;
    afStack_f48[1] = 1.442695;
    local_fc0[0] = 0.5;
    local_fc0[1] = 0.5;
    afStack_fb8[0] = 0.5;
    afStack_fb8[1] = 0.5;
    afStack_fb0[0] = 0.5;
    afStack_fb0[1] = 0.5;
    afStack_fa8[0] = 0.5;
    afStack_fa8[1] = 0.5;
    afStack_fa0[0] = 0.5;
    afStack_fa0[1] = 0.5;
    afStack_f98[0] = 0.5;
    afStack_f98[1] = 0.5;
    afStack_f90[0] = 0.5;
    afStack_f90[1] = 0.5;
    afStack_f88[0] = 0.5;
    afStack_f88[1] = 0.5;
    auVar43._8_4_ = 1.442695;
    auVar43._12_4_ = 1.442695;
    auVar43._0_4_ = 1.442695;
    auVar43._4_4_ = 1.442695;
    auVar43._16_4_ = 1.442695;
    auVar43._20_4_ = 1.442695;
    auVar43._24_4_ = 1.442695;
    auVar43._28_4_ = 1.442695;
    auVar43._32_4_ = 1.442695;
    auVar43._36_4_ = 1.442695;
    auVar43._40_4_ = 1.442695;
    auVar43._44_4_ = 1.442695;
    auVar43._48_4_ = 1.442695;
    auVar43._52_4_ = 1.442695;
    auVar43._56_4_ = 1.442695;
    auVar43._60_4_ = 1.442695;
    auVar42._8_4_ = 0.5;
    auVar42._12_4_ = 0.5;
    auVar42._0_4_ = 0.5;
    auVar42._4_4_ = 0.5;
    auVar42._16_4_ = 0.5;
    auVar42._20_4_ = 0.5;
    auVar42._24_4_ = 0.5;
    auVar42._28_4_ = 0.5;
    auVar42._32_4_ = 0.5;
    auVar42._36_4_ = 0.5;
    auVar42._40_4_ = 0.5;
    auVar42._44_4_ = 0.5;
    auVar42._48_4_ = 0.5;
    auVar42._52_4_ = 0.5;
    auVar42._56_4_ = 0.5;
    auVar42._60_4_ = 0.5;
    auVar91 = vfmadd213ps_avx512f(auVar43,auVar90,auVar42);
    auVar92 = vrndscaleps_avx512f(auVar91,1);
    uVar21 = vcmpps_avx512f(auVar91,auVar92,1);
    local_27c2 = (ushort)uVar21;
    local_2700._0_8_ = auVar92._0_8_;
    local_ec0 = local_2700._0_8_;
    local_2700._8_8_ = auVar92._8_8_;
    uStack_eb8 = local_2700._8_8_;
    local_2700._16_8_ = auVar92._16_8_;
    uStack_eb0 = local_2700._16_8_;
    local_2700._24_8_ = auVar92._24_8_;
    uStack_ea8 = local_2700._24_8_;
    local_2700._32_8_ = auVar92._32_8_;
    uStack_ea0 = local_2700._32_8_;
    local_2700._40_8_ = auVar92._40_8_;
    uStack_e98 = local_2700._40_8_;
    local_2700._48_8_ = auVar92._48_8_;
    uStack_e90 = local_2700._48_8_;
    local_2700._56_8_ = auVar92._56_8_;
    uStack_e88 = local_2700._56_8_;
    local_f00[0] = 1.0;
    local_f00[1] = 1.0;
    afStack_ef8[0] = 1.0;
    afStack_ef8[1] = 1.0;
    afStack_ef0[0] = 1.0;
    afStack_ef0[1] = 1.0;
    afStack_ee8[0] = 1.0;
    afStack_ee8[1] = 1.0;
    afStack_ee0[0] = 1.0;
    afStack_ee0[1] = 1.0;
    afStack_ed8[0] = 1.0;
    afStack_ed8[1] = 1.0;
    afStack_ed0[0] = 1.0;
    afStack_ed0[1] = 1.0;
    afStack_ec8[0] = 1.0;
    afStack_ec8[1] = 1.0;
    local_dc0 = local_2700._0_8_;
    uStack_db8 = local_2700._8_8_;
    uStack_db0 = local_2700._16_8_;
    uStack_da8 = local_2700._24_8_;
    uStack_da0 = local_2700._32_8_;
    uStack_d98 = local_2700._40_8_;
    uStack_d90 = local_2700._48_8_;
    uStack_d88 = local_2700._56_8_;
    local_e00[0] = 1.0;
    local_e00[1] = 1.0;
    afStack_df8[0] = 1.0;
    afStack_df8[1] = 1.0;
    afStack_df0[0] = 1.0;
    afStack_df0[1] = 1.0;
    afStack_de8[0] = 1.0;
    afStack_de8[1] = 1.0;
    afStack_de0[0] = 1.0;
    afStack_de0[1] = 1.0;
    afStack_dd8[0] = 1.0;
    afStack_dd8[1] = 1.0;
    afStack_dd0[0] = 1.0;
    afStack_dd0[1] = 1.0;
    afStack_dc8[0] = 1.0;
    afStack_dc8[1] = 1.0;
    auVar44._8_4_ = 1.0;
    auVar44._12_4_ = 1.0;
    auVar44._0_4_ = 1.0;
    auVar44._4_4_ = 1.0;
    auVar44._16_4_ = 1.0;
    auVar44._20_4_ = 1.0;
    auVar44._24_4_ = 1.0;
    auVar44._28_4_ = 1.0;
    auVar44._32_4_ = 1.0;
    auVar44._36_4_ = 1.0;
    auVar44._40_4_ = 1.0;
    auVar44._44_4_ = 1.0;
    auVar44._48_4_ = 1.0;
    auVar44._52_4_ = 1.0;
    auVar44._56_4_ = 1.0;
    auVar44._60_4_ = 1.0;
    local_e40._0_4_ = auVar92._0_4_;
    local_e40._4_4_ = auVar92._4_4_;
    uStack_e38._0_4_ = auVar92._8_4_;
    uStack_e38._4_4_ = auVar92._12_4_;
    uStack_e30._0_4_ = auVar92._16_4_;
    uStack_e30._4_4_ = auVar92._20_4_;
    uStack_e28._0_4_ = auVar92._24_4_;
    uStack_e28._4_4_ = auVar92._28_4_;
    uStack_e20._0_4_ = auVar92._32_4_;
    uStack_e20._4_4_ = auVar92._36_4_;
    uStack_e18._0_4_ = auVar92._40_4_;
    uStack_e18._4_4_ = auVar92._44_4_;
    uStack_e10._0_4_ = auVar92._48_4_;
    uStack_e10._4_4_ = auVar92._52_4_;
    uStack_e08._0_4_ = auVar92._56_4_;
    uStack_e08._4_4_ = auVar92._60_4_;
    auVar91 = vsubps_avx512f(auVar92,auVar44);
    bVar1 = (bool)((byte)uVar21 & 1);
    bVar2 = (bool)((byte)(local_27c2 >> 1) & 1);
    bVar3 = (bool)((byte)(local_27c2 >> 2) & 1);
    bVar4 = (bool)((byte)(local_27c2 >> 3) & 1);
    bVar5 = (bool)((byte)(local_27c2 >> 4) & 1);
    bVar6 = (bool)((byte)(local_27c2 >> 5) & 1);
    bVar7 = (bool)((byte)(local_27c2 >> 6) & 1);
    bVar8 = (bool)((byte)(local_27c2 >> 7) & 1);
    bVar9 = (byte)((ulong)uVar21 >> 8);
    bVar10 = (bool)(bVar9 >> 1 & 1);
    bVar11 = (bool)(bVar9 >> 2 & 1);
    bVar12 = (bool)(bVar9 >> 3 & 1);
    bVar13 = (bool)(bVar9 >> 4 & 1);
    bVar14 = (bool)(bVar9 >> 5 & 1);
    bVar15 = (bool)(bVar9 >> 6 & 1);
    local_2740._4_4_ = (uint)bVar2 * auVar91._4_4_ | (uint)!bVar2 * local_e40._4_4_;
    local_2740._0_4_ = (uint)bVar1 * auVar91._0_4_ | (uint)!bVar1 * (int)local_e40;
    local_2740._8_4_ = (uint)bVar3 * auVar91._8_4_ | (uint)!bVar3 * (int)uStack_e38;
    local_2740._12_4_ = (uint)bVar4 * auVar91._12_4_ | (uint)!bVar4 * uStack_e38._4_4_;
    uStack_2730._0_4_ = (uint)bVar5 * auVar91._16_4_ | (uint)!bVar5 * (int)uStack_e30;
    uStack_2730._4_4_ = (uint)bVar6 * auVar91._20_4_ | (uint)!bVar6 * uStack_e30._4_4_;
    auVar76 = _local_2740;
    uStack_2728._0_4_ = (uint)bVar7 * auVar91._24_4_ | (uint)!bVar7 * (int)uStack_e28;
    uStack_2728._4_4_ = (uint)bVar8 * auVar91._28_4_ | (uint)!bVar8 * uStack_e28._4_4_;
    auVar89 = _local_2740;
    uStack_2720._0_4_ =
         (uint)(bVar9 & 1) * auVar91._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_e20;
    uStack_2720._4_4_ = (uint)bVar10 * auVar91._36_4_ | (uint)!bVar10 * uStack_e20._4_4_;
    auVar77 = _local_2740;
    uStack_2718._0_4_ = (uint)bVar11 * auVar91._40_4_ | (uint)!bVar11 * (int)uStack_e18;
    uStack_2718._4_4_ = (uint)bVar12 * auVar91._44_4_ | (uint)!bVar12 * uStack_e18._4_4_;
    auVar78 = _local_2740;
    uStack_2710._0_4_ = (uint)bVar13 * auVar91._48_4_ | (uint)!bVar13 * (int)uStack_e10;
    uStack_2710._4_4_ = (uint)bVar14 * auVar91._52_4_ | (uint)!bVar14 * uStack_e10._4_4_;
    auVar75 = _local_2740;
    uStack_2708._0_4_ = (uint)bVar15 * auVar91._56_4_ | (uint)!bVar15 * (int)uStack_e08;
    uStack_2708._4_4_ =
         (uint)(bVar9 >> 7) * auVar91._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_e08._4_4_;
    auVar92 = _local_2740;
    local_c40 = local_2740._0_8_;
    uStack_c38 = local_2740._8_8_;
    uStack_2730 = auVar76._16_8_;
    uStack_c30 = uStack_2730;
    uStack_2728 = auVar89._24_8_;
    uStack_c28 = uStack_2728;
    uStack_2720 = auVar77._32_8_;
    uStack_c20 = uStack_2720;
    uStack_2718 = auVar78._40_8_;
    uStack_c18 = uStack_2718;
    uStack_2710 = auVar75._48_8_;
    uStack_c10 = uStack_2710;
    uStack_2708 = auVar92._56_8_;
    uStack_c08 = uStack_2708;
    local_c80[0] = 0.6933594;
    local_c80[1] = 0.6933594;
    afStack_c78[0] = 0.6933594;
    afStack_c78[1] = 0.6933594;
    afStack_c70[0] = 0.6933594;
    afStack_c70[1] = 0.6933594;
    afStack_c68[0] = 0.6933594;
    afStack_c68[1] = 0.6933594;
    afStack_c60[0] = 0.6933594;
    afStack_c60[1] = 0.6933594;
    afStack_c58[0] = 0.6933594;
    afStack_c58[1] = 0.6933594;
    afStack_c50[0] = 0.6933594;
    afStack_c50[1] = 0.6933594;
    afStack_c48[0] = 0.6933594;
    afStack_c48[1] = 0.6933594;
    local_cc0 = local_26c0._0_8_;
    uStack_cb8 = local_26c0._8_8_;
    uStack_cb0 = local_26c0._16_8_;
    uStack_ca8 = local_26c0._24_8_;
    uStack_ca0 = local_26c0._32_8_;
    uStack_c98 = local_26c0._40_8_;
    uStack_c90 = local_26c0._48_8_;
    uStack_c88 = local_26c0._56_8_;
    auVar48._16_8_ = uStack_2730;
    auVar48._0_16_ = local_2740;
    auVar48._24_8_ = uStack_2728;
    auVar48._32_8_ = uStack_2720;
    auVar48._40_8_ = uStack_2718;
    auVar48._48_8_ = uStack_2710;
    auVar48._56_8_ = uStack_2708;
    auVar47._8_4_ = 0.6933594;
    auVar47._12_4_ = 0.6933594;
    auVar47._0_4_ = 0.6933594;
    auVar47._4_4_ = 0.6933594;
    auVar47._16_4_ = 0.6933594;
    auVar47._20_4_ = 0.6933594;
    auVar47._24_4_ = 0.6933594;
    auVar47._28_4_ = 0.6933594;
    auVar47._32_4_ = 0.6933594;
    auVar47._36_4_ = 0.6933594;
    auVar47._40_4_ = 0.6933594;
    auVar47._44_4_ = 0.6933594;
    auVar47._48_4_ = 0.6933594;
    auVar47._52_4_ = 0.6933594;
    auVar47._56_4_ = 0.6933594;
    auVar47._60_4_ = 0.6933594;
    auVar90 = vfnmadd213ps_avx512f(auVar47,auVar48,auVar90);
    local_d00 = local_2740._0_8_;
    uStack_cf8 = local_2740._8_8_;
    uStack_cf0 = uStack_2730;
    uStack_ce8 = uStack_2728;
    uStack_ce0 = uStack_2720;
    uStack_cd8 = uStack_2718;
    uStack_cd0 = uStack_2710;
    uStack_cc8 = uStack_2708;
    local_d40[0] = -0.00021219444;
    local_d40[1] = -0.00021219444;
    afStack_d38[0] = -0.00021219444;
    afStack_d38[1] = -0.00021219444;
    afStack_d30[0] = -0.00021219444;
    afStack_d30[1] = -0.00021219444;
    afStack_d28[0] = -0.00021219444;
    afStack_d28[1] = -0.00021219444;
    afStack_d20[0] = -0.00021219444;
    afStack_d20[1] = -0.00021219444;
    afStack_d18[0] = -0.00021219444;
    afStack_d18[1] = -0.00021219444;
    afStack_d10[0] = -0.00021219444;
    afStack_d10[1] = -0.00021219444;
    afStack_d08[0] = -0.00021219444;
    afStack_d08[1] = -0.00021219444;
    local_26c0._0_8_ = auVar90._0_8_;
    local_d80 = local_26c0._0_8_;
    local_26c0._8_8_ = auVar90._8_8_;
    uStack_d78 = local_26c0._8_8_;
    local_26c0._16_8_ = auVar90._16_8_;
    uStack_d70 = local_26c0._16_8_;
    local_26c0._24_8_ = auVar90._24_8_;
    uStack_d68 = local_26c0._24_8_;
    local_26c0._32_8_ = auVar90._32_8_;
    uStack_d60 = local_26c0._32_8_;
    local_26c0._40_8_ = auVar90._40_8_;
    uStack_d58 = local_26c0._40_8_;
    local_26c0._48_8_ = auVar90._48_8_;
    uStack_d50 = local_26c0._48_8_;
    local_26c0._56_8_ = auVar90._56_8_;
    uStack_d48 = local_26c0._56_8_;
    auVar46._16_8_ = uStack_2730;
    auVar46._0_16_ = local_2740;
    auVar46._24_8_ = uStack_2728;
    auVar46._32_8_ = uStack_2720;
    auVar46._40_8_ = uStack_2718;
    auVar46._48_8_ = uStack_2710;
    auVar46._56_8_ = uStack_2708;
    auVar45._8_4_ = -0.00021219444;
    auVar45._12_4_ = -0.00021219444;
    auVar45._0_4_ = -0.00021219444;
    auVar45._4_4_ = -0.00021219444;
    auVar45._16_4_ = -0.00021219444;
    auVar45._20_4_ = -0.00021219444;
    auVar45._24_4_ = -0.00021219444;
    auVar45._28_4_ = -0.00021219444;
    auVar45._32_4_ = -0.00021219444;
    auVar45._36_4_ = -0.00021219444;
    auVar45._40_4_ = -0.00021219444;
    auVar45._44_4_ = -0.00021219444;
    auVar45._48_4_ = -0.00021219444;
    auVar45._52_4_ = -0.00021219444;
    auVar45._56_4_ = -0.00021219444;
    auVar45._60_4_ = -0.00021219444;
    local_26c0 = vfnmadd213ps_avx512f(auVar45,auVar46,auVar90);
    local_1a80 = local_26c0._0_8_;
    uStack_1a78 = local_26c0._8_8_;
    uStack_1a70 = local_26c0._16_8_;
    uStack_1a68 = local_26c0._24_8_;
    uStack_1a60 = local_26c0._32_8_;
    uStack_1a58 = local_26c0._40_8_;
    uStack_1a50 = local_26c0._48_8_;
    uStack_1a48 = local_26c0._56_8_;
    local_2700 = vmulps_avx512f(local_26c0,local_26c0);
    uStack_2838._0_4_ = 0.00019875691;
    uStack_2838._4_4_ = 0.00019875691;
    local_2840._0_4_ = 0.00019875691;
    local_2840._4_4_ = 0.00019875691;
    local_1000[0] = 0.00019875691;
    local_1000[1] = 0.00019875691;
    afStack_ff8[0] = 0.00019875691;
    afStack_ff8[1] = 0.00019875691;
    afStack_ff0[0] = 0.00019875691;
    afStack_ff0[1] = 0.00019875691;
    afStack_fe8[0] = 0.00019875691;
    afStack_fe8[1] = 0.00019875691;
    afStack_fe0[0] = 0.00019875691;
    afStack_fe0[1] = 0.00019875691;
    afStack_fd8[0] = 0.00019875691;
    afStack_fd8[1] = 0.00019875691;
    afStack_fd0[0] = 0.00019875691;
    afStack_fd0[1] = 0.00019875691;
    afStack_fc8[0] = 0.00019875691;
    afStack_fc8[1] = 0.00019875691;
    local_1040 = local_26c0._0_8_;
    uStack_1038 = local_26c0._8_8_;
    uStack_1030 = local_26c0._16_8_;
    uStack_1028 = local_26c0._24_8_;
    uStack_1020 = local_26c0._32_8_;
    uStack_1018 = local_26c0._40_8_;
    uStack_1010 = local_26c0._48_8_;
    uStack_1008 = local_26c0._56_8_;
    local_1080[0] = 0.0013981999;
    local_1080[1] = 0.0013981999;
    afStack_1078[0] = 0.0013981999;
    afStack_1078[1] = 0.0013981999;
    afStack_1070[0] = 0.0013981999;
    afStack_1070[1] = 0.0013981999;
    afStack_1068[0] = 0.0013981999;
    afStack_1068[1] = 0.0013981999;
    afStack_1060[0] = 0.0013981999;
    afStack_1060[1] = 0.0013981999;
    afStack_1058[0] = 0.0013981999;
    afStack_1058[1] = 0.0013981999;
    afStack_1050[0] = 0.0013981999;
    afStack_1050[1] = 0.0013981999;
    afStack_1048[0] = 0.0013981999;
    afStack_1048[1] = 0.0013981999;
    auVar41._16_4_ = 0.00019875691;
    auVar41._20_4_ = 0.00019875691;
    auVar41._0_16_ = _local_2840;
    auVar41._24_4_ = 0.00019875691;
    auVar41._28_4_ = 0.00019875691;
    auVar41._32_4_ = 0.00019875691;
    auVar41._36_4_ = 0.00019875691;
    auVar41._40_4_ = 0.00019875691;
    auVar41._44_4_ = 0.00019875691;
    auVar41._48_4_ = 0.00019875691;
    auVar41._52_4_ = 0.00019875691;
    auVar41._56_4_ = 0.00019875691;
    auVar41._60_4_ = 0.00019875691;
    auVar40._8_4_ = 0.0013981999;
    auVar40._12_4_ = 0.0013981999;
    auVar40._0_4_ = 0.0013981999;
    auVar40._4_4_ = 0.0013981999;
    auVar40._16_4_ = 0.0013981999;
    auVar40._20_4_ = 0.0013981999;
    auVar40._24_4_ = 0.0013981999;
    auVar40._28_4_ = 0.0013981999;
    auVar40._32_4_ = 0.0013981999;
    auVar40._36_4_ = 0.0013981999;
    auVar40._40_4_ = 0.0013981999;
    auVar40._44_4_ = 0.0013981999;
    auVar40._48_4_ = 0.0013981999;
    auVar40._52_4_ = 0.0013981999;
    auVar40._56_4_ = 0.0013981999;
    auVar40._60_4_ = 0.0013981999;
    auVar90 = vfmadd213ps_avx512f(local_26c0,auVar41,auVar40);
    local_2840 = auVar90._0_8_;
    local_10c0 = local_2840;
    uStack_2838 = auVar90._8_8_;
    uStack_10b8 = uStack_2838;
    uStack_2830 = auVar90._16_8_;
    uStack_10b0 = uStack_2830;
    uStack_2828 = auVar90._24_8_;
    uStack_10a8 = uStack_2828;
    uStack_2820 = auVar90._32_8_;
    uStack_10a0 = uStack_2820;
    uStack_2818 = auVar90._40_8_;
    uStack_1098 = uStack_2818;
    uStack_2810 = auVar90._48_8_;
    uStack_1090 = uStack_2810;
    uStack_2808 = auVar90._56_8_;
    uStack_1088 = uStack_2808;
    local_1100 = local_26c0._0_8_;
    uStack_10f8 = local_26c0._8_8_;
    uStack_10f0 = local_26c0._16_8_;
    uStack_10e8 = local_26c0._24_8_;
    uStack_10e0 = local_26c0._32_8_;
    uStack_10d8 = local_26c0._40_8_;
    uStack_10d0 = local_26c0._48_8_;
    uStack_10c8 = local_26c0._56_8_;
    local_1140[0] = 0.008333452;
    local_1140[1] = 0.008333452;
    afStack_1138[0] = 0.008333452;
    afStack_1138[1] = 0.008333452;
    afStack_1130[0] = 0.008333452;
    afStack_1130[1] = 0.008333452;
    afStack_1128[0] = 0.008333452;
    afStack_1128[1] = 0.008333452;
    afStack_1120[0] = 0.008333452;
    afStack_1120[1] = 0.008333452;
    afStack_1118[0] = 0.008333452;
    afStack_1118[1] = 0.008333452;
    afStack_1110[0] = 0.008333452;
    afStack_1110[1] = 0.008333452;
    afStack_1108[0] = 0.008333452;
    afStack_1108[1] = 0.008333452;
    auVar39._8_4_ = 0.008333452;
    auVar39._12_4_ = 0.008333452;
    auVar39._0_4_ = 0.008333452;
    auVar39._4_4_ = 0.008333452;
    auVar39._16_4_ = 0.008333452;
    auVar39._20_4_ = 0.008333452;
    auVar39._24_4_ = 0.008333452;
    auVar39._28_4_ = 0.008333452;
    auVar39._32_4_ = 0.008333452;
    auVar39._36_4_ = 0.008333452;
    auVar39._40_4_ = 0.008333452;
    auVar39._44_4_ = 0.008333452;
    auVar39._48_4_ = 0.008333452;
    auVar39._52_4_ = 0.008333452;
    auVar39._56_4_ = 0.008333452;
    auVar39._60_4_ = 0.008333452;
    auVar90 = vfmadd213ps_avx512f(local_26c0,auVar90,auVar39);
    local_2840 = auVar90._0_8_;
    local_1180 = local_2840;
    uStack_2838 = auVar90._8_8_;
    uStack_1178 = uStack_2838;
    uStack_2830 = auVar90._16_8_;
    uStack_1170 = uStack_2830;
    uStack_2828 = auVar90._24_8_;
    uStack_1168 = uStack_2828;
    uStack_2820 = auVar90._32_8_;
    uStack_1160 = uStack_2820;
    uStack_2818 = auVar90._40_8_;
    uStack_1158 = uStack_2818;
    uStack_2810 = auVar90._48_8_;
    uStack_1150 = uStack_2810;
    uStack_2808 = auVar90._56_8_;
    uStack_1148 = uStack_2808;
    local_11c0 = local_26c0._0_8_;
    uStack_11b8 = local_26c0._8_8_;
    uStack_11b0 = local_26c0._16_8_;
    uStack_11a8 = local_26c0._24_8_;
    uStack_11a0 = local_26c0._32_8_;
    uStack_1198 = local_26c0._40_8_;
    uStack_1190 = local_26c0._48_8_;
    uStack_1188 = local_26c0._56_8_;
    local_1200[0] = 0.041665796;
    local_1200[1] = 0.041665796;
    afStack_11f8[0] = 0.041665796;
    afStack_11f8[1] = 0.041665796;
    afStack_11f0[0] = 0.041665796;
    afStack_11f0[1] = 0.041665796;
    afStack_11e8[0] = 0.041665796;
    afStack_11e8[1] = 0.041665796;
    afStack_11e0[0] = 0.041665796;
    afStack_11e0[1] = 0.041665796;
    afStack_11d8[0] = 0.041665796;
    afStack_11d8[1] = 0.041665796;
    afStack_11d0[0] = 0.041665796;
    afStack_11d0[1] = 0.041665796;
    afStack_11c8[0] = 0.041665796;
    afStack_11c8[1] = 0.041665796;
    auVar38._8_4_ = 0.041665796;
    auVar38._12_4_ = 0.041665796;
    auVar38._0_4_ = 0.041665796;
    auVar38._4_4_ = 0.041665796;
    auVar38._16_4_ = 0.041665796;
    auVar38._20_4_ = 0.041665796;
    auVar38._24_4_ = 0.041665796;
    auVar38._28_4_ = 0.041665796;
    auVar38._32_4_ = 0.041665796;
    auVar38._36_4_ = 0.041665796;
    auVar38._40_4_ = 0.041665796;
    auVar38._44_4_ = 0.041665796;
    auVar38._48_4_ = 0.041665796;
    auVar38._52_4_ = 0.041665796;
    auVar38._56_4_ = 0.041665796;
    auVar38._60_4_ = 0.041665796;
    auVar90 = vfmadd213ps_avx512f(local_26c0,auVar90,auVar38);
    local_2840 = auVar90._0_8_;
    local_1240 = local_2840;
    uStack_2838 = auVar90._8_8_;
    uStack_1238 = uStack_2838;
    uStack_2830 = auVar90._16_8_;
    uStack_1230 = uStack_2830;
    uStack_2828 = auVar90._24_8_;
    uStack_1228 = uStack_2828;
    uStack_2820 = auVar90._32_8_;
    uStack_1220 = uStack_2820;
    uStack_2818 = auVar90._40_8_;
    uStack_1218 = uStack_2818;
    uStack_2810 = auVar90._48_8_;
    uStack_1210 = uStack_2810;
    uStack_2808 = auVar90._56_8_;
    uStack_1208 = uStack_2808;
    local_1280 = local_26c0._0_8_;
    uStack_1278 = local_26c0._8_8_;
    uStack_1270 = local_26c0._16_8_;
    uStack_1268 = local_26c0._24_8_;
    uStack_1260 = local_26c0._32_8_;
    uStack_1258 = local_26c0._40_8_;
    uStack_1250 = local_26c0._48_8_;
    uStack_1248 = local_26c0._56_8_;
    local_12c0[0] = 0.16666666;
    local_12c0[1] = 0.16666666;
    afStack_12b8[0] = 0.16666666;
    afStack_12b8[1] = 0.16666666;
    afStack_12b0[0] = 0.16666666;
    afStack_12b0[1] = 0.16666666;
    afStack_12a8[0] = 0.16666666;
    afStack_12a8[1] = 0.16666666;
    afStack_12a0[0] = 0.16666666;
    afStack_12a0[1] = 0.16666666;
    afStack_1298[0] = 0.16666666;
    afStack_1298[1] = 0.16666666;
    afStack_1290[0] = 0.16666666;
    afStack_1290[1] = 0.16666666;
    afStack_1288[0] = 0.16666666;
    afStack_1288[1] = 0.16666666;
    auVar37._8_4_ = 0.16666666;
    auVar37._12_4_ = 0.16666666;
    auVar37._0_4_ = 0.16666666;
    auVar37._4_4_ = 0.16666666;
    auVar37._16_4_ = 0.16666666;
    auVar37._20_4_ = 0.16666666;
    auVar37._24_4_ = 0.16666666;
    auVar37._28_4_ = 0.16666666;
    auVar37._32_4_ = 0.16666666;
    auVar37._36_4_ = 0.16666666;
    auVar37._40_4_ = 0.16666666;
    auVar37._44_4_ = 0.16666666;
    auVar37._48_4_ = 0.16666666;
    auVar37._52_4_ = 0.16666666;
    auVar37._56_4_ = 0.16666666;
    auVar37._60_4_ = 0.16666666;
    auVar90 = vfmadd213ps_avx512f(local_26c0,auVar90,auVar37);
    local_2840 = auVar90._0_8_;
    local_1300 = local_2840;
    uStack_2838 = auVar90._8_8_;
    uStack_12f8 = uStack_2838;
    uStack_2830 = auVar90._16_8_;
    uStack_12f0 = uStack_2830;
    uStack_2828 = auVar90._24_8_;
    uStack_12e8 = uStack_2828;
    uStack_2820 = auVar90._32_8_;
    uStack_12e0 = uStack_2820;
    uStack_2818 = auVar90._40_8_;
    uStack_12d8 = uStack_2818;
    uStack_2810 = auVar90._48_8_;
    uStack_12d0 = uStack_2810;
    uStack_2808 = auVar90._56_8_;
    uStack_12c8 = uStack_2808;
    local_1340 = local_26c0._0_8_;
    uStack_1338 = local_26c0._8_8_;
    uStack_1330 = local_26c0._16_8_;
    uStack_1328 = local_26c0._24_8_;
    uStack_1320 = local_26c0._32_8_;
    uStack_1318 = local_26c0._40_8_;
    uStack_1310 = local_26c0._48_8_;
    uStack_1308 = local_26c0._56_8_;
    local_1380[0] = 0.5;
    local_1380[1] = 0.5;
    afStack_1378[0] = 0.5;
    afStack_1378[1] = 0.5;
    afStack_1370[0] = 0.5;
    afStack_1370[1] = 0.5;
    afStack_1368[0] = 0.5;
    afStack_1368[1] = 0.5;
    afStack_1360[0] = 0.5;
    afStack_1360[1] = 0.5;
    afStack_1358[0] = 0.5;
    afStack_1358[1] = 0.5;
    afStack_1350[0] = 0.5;
    afStack_1350[1] = 0.5;
    afStack_1348[0] = 0.5;
    afStack_1348[1] = 0.5;
    auVar93._8_4_ = 0.5;
    auVar93._12_4_ = 0.5;
    auVar93._0_4_ = 0.5;
    auVar93._4_4_ = 0.5;
    auVar93._16_4_ = 0.5;
    auVar93._20_4_ = 0.5;
    auVar93._24_4_ = 0.5;
    auVar93._28_4_ = 0.5;
    auVar93._32_4_ = 0.5;
    auVar93._36_4_ = 0.5;
    auVar93._40_4_ = 0.5;
    auVar93._44_4_ = 0.5;
    auVar93._48_4_ = 0.5;
    auVar93._52_4_ = 0.5;
    auVar93._56_4_ = 0.5;
    auVar93._60_4_ = 0.5;
    auVar90 = vfmadd213ps_avx512f(local_26c0,auVar90,auVar93);
    local_2840 = auVar90._0_8_;
    local_13c0 = local_2840;
    uStack_2838 = auVar90._8_8_;
    uStack_13b8 = uStack_2838;
    uStack_2830 = auVar90._16_8_;
    uStack_13b0 = uStack_2830;
    uStack_2828 = auVar90._24_8_;
    uStack_13a8 = uStack_2828;
    uStack_2820 = auVar90._32_8_;
    uStack_13a0 = uStack_2820;
    uStack_2818 = auVar90._40_8_;
    uStack_1398 = uStack_2818;
    uStack_2810 = auVar90._48_8_;
    uStack_1390 = uStack_2810;
    uStack_2808 = auVar90._56_8_;
    uStack_1388 = uStack_2808;
    local_1400 = local_2700._0_8_;
    uStack_13f8 = local_2700._8_8_;
    uStack_13f0 = local_2700._16_8_;
    uStack_13e8 = local_2700._24_8_;
    uStack_13e0 = local_2700._32_8_;
    uStack_13d8 = local_2700._40_8_;
    uStack_13d0 = local_2700._48_8_;
    uStack_13c8 = local_2700._56_8_;
    local_1440 = local_26c0._0_8_;
    uStack_1438 = local_26c0._8_8_;
    uStack_1430 = local_26c0._16_8_;
    uStack_1428 = local_26c0._24_8_;
    uStack_1420 = local_26c0._32_8_;
    uStack_1418 = local_26c0._40_8_;
    uStack_1410 = local_26c0._48_8_;
    uStack_1408 = local_26c0._56_8_;
    auVar90 = vfmadd213ps_avx512f(local_2700,auVar90,local_26c0);
    local_2840 = auVar90._0_8_;
    local_24c0 = local_2840;
    uStack_2838 = auVar90._8_8_;
    uStack_24b8 = uStack_2838;
    uStack_2830 = auVar90._16_8_;
    uStack_24b0 = uStack_2830;
    uStack_2828 = auVar90._24_8_;
    uStack_24a8 = uStack_2828;
    uStack_2820 = auVar90._32_8_;
    uStack_24a0 = uStack_2820;
    uStack_2818 = auVar90._40_8_;
    uStack_2498 = uStack_2818;
    uStack_2810 = auVar90._48_8_;
    uStack_2490 = uStack_2810;
    uStack_2808 = auVar90._56_8_;
    uStack_2488 = uStack_2808;
    local_2500[0] = 1.0;
    local_2500[1] = 1.0;
    afStack_24f8[0] = 1.0;
    afStack_24f8[1] = 1.0;
    afStack_24f0[0] = 1.0;
    afStack_24f0[1] = 1.0;
    afStack_24e8[0] = 1.0;
    afStack_24e8[1] = 1.0;
    afStack_24e0[0] = 1.0;
    afStack_24e0[1] = 1.0;
    afStack_24d8[0] = 1.0;
    afStack_24d8[1] = 1.0;
    afStack_24d0[0] = 1.0;
    afStack_24d0[1] = 1.0;
    afStack_24c8[0] = 1.0;
    afStack_24c8[1] = 1.0;
    auVar91._8_4_ = 1.0;
    auVar91._12_4_ = 1.0;
    auVar91._0_4_ = 1.0;
    auVar91._4_4_ = 1.0;
    auVar91._16_4_ = 1.0;
    auVar91._20_4_ = 1.0;
    auVar91._24_4_ = 1.0;
    auVar91._28_4_ = 1.0;
    auVar91._32_4_ = 1.0;
    auVar91._36_4_ = 1.0;
    auVar91._40_4_ = 1.0;
    auVar91._44_4_ = 1.0;
    auVar91._48_4_ = 1.0;
    auVar91._52_4_ = 1.0;
    auVar91._56_4_ = 1.0;
    auVar91._60_4_ = 1.0;
    auVar91 = vaddps_avx512f(auVar90,auVar91);
    local_c00 = local_2740._0_8_;
    uStack_bf8 = local_2740._8_8_;
    uStack_bf0 = uStack_2730;
    uStack_be8 = uStack_2728;
    uStack_be0 = uStack_2720;
    uStack_bd8 = uStack_2718;
    uStack_bd0 = uStack_2710;
    uStack_bc8 = uStack_2708;
    auVar49._16_8_ = uStack_2730;
    auVar49._0_16_ = local_2740;
    auVar49._24_8_ = uStack_2728;
    auVar49._32_8_ = uStack_2720;
    auVar49._40_8_ = uStack_2718;
    auVar49._48_8_ = uStack_2710;
    auVar49._56_8_ = uStack_2708;
    local_a80 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
    vmovdqa64_avx512f(local_a80);
    auVar90 = vcvttps2dq_avx512f(auVar49);
    auVar90 = vmovdqa64_avx512f(auVar90);
    auVar90 = vmovdqa64_avx512f(auVar90);
    auVar93 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
    local_b80 = vmovdqa64_avx512f(auVar90);
    local_bc0 = vmovdqa64_avx512f(auVar93);
    auVar90 = vmovdqa64_avx512f(local_b80);
    auVar93 = vmovdqa64_avx512f(local_bc0);
    auVar90 = vpaddd_avx512f(auVar90,auVar93);
    auVar90 = vmovdqa64_avx512f(auVar90);
    auVar90 = vmovdqa64_avx512f(auVar90);
    local_b00 = vmovdqa64_avx512f(auVar90);
    local_b04 = 0x17;
    auVar90 = vmovdqa64_avx512f(local_b00);
    auVar90 = vpslld_avx512f(auVar90,ZEXT416(0x17));
    local_2780 = vmovdqa64_avx512f(auVar90);
    auVar90 = vmovdqa64_avx512f(local_2780);
    local_ac0 = vmovdqa64_avx512f(auVar90);
    local_2880 = vmovdqa64_avx512f(local_ac0);
    local_2840 = auVar91._0_8_;
    local_1ac0 = local_2840;
    uStack_2838 = auVar91._8_8_;
    uStack_1ab8 = uStack_2838;
    uStack_2830 = auVar91._16_8_;
    uStack_1ab0 = uStack_2830;
    uStack_2828 = auVar91._24_8_;
    uStack_1aa8 = uStack_2828;
    uStack_2820 = auVar91._32_8_;
    uStack_1aa0 = uStack_2820;
    uStack_2818 = auVar91._40_8_;
    uStack_1a98 = uStack_2818;
    uStack_2810 = auVar91._48_8_;
    uStack_1a90 = uStack_2810;
    uStack_2808 = auVar91._56_8_;
    uStack_1a88 = uStack_2808;
    local_1b00 = local_2880._0_8_;
    uStack_1af8 = local_2880._8_8_;
    uStack_1af0 = local_2880._16_8_;
    uStack_1ae8 = local_2880._24_8_;
    uStack_1ae0 = local_2880._32_8_;
    uStack_1ad8 = local_2880._40_8_;
    uStack_1ad0 = local_2880._48_8_;
    uStack_1ac8 = local_2880._56_8_;
    _local_2840 = vmulps_avx512f(auVar91,local_2880);
    local_2508 = local_37c0;
    local_2580 = local_2840;
    uStack_2578 = uStack_2838;
    uStack_2570 = uStack_2830;
    uStack_2568 = uStack_2828;
    uStack_2560 = uStack_2820;
    uStack_2558 = uStack_2818;
    uStack_2550 = uStack_2810;
    uStack_2548 = uStack_2808;
    *(undefined1 (*) [8])*local_37c0 = local_2840;
    *(undefined8 *)(*local_37c0 + 8) = uStack_2838;
    *(undefined8 *)(*local_37c0 + 0x10) = uStack_2830;
    *(undefined8 *)(*local_37c0 + 0x18) = uStack_2828;
    *(undefined8 *)(*local_37c0 + 0x20) = uStack_2820;
    *(undefined8 *)(*local_37c0 + 0x28) = uStack_2818;
    *(undefined8 *)(*local_37c0 + 0x30) = uStack_2810;
    *(undefined8 *)(*local_37c0 + 0x38) = uStack_2808;
    local_2440 = local_3780;
    local_2480 = local_2840;
    uStack_2478 = uStack_2838;
    uStack_2470 = uStack_2830;
    uStack_2468 = uStack_2828;
    uStack_2460 = uStack_2820;
    uStack_2458 = uStack_2818;
    uStack_2450 = uStack_2810;
    uStack_2448 = uStack_2808;
    local_3780 = vaddps_avx512f(local_3780,_local_2840);
    local_37c0 = local_37c0 + 1;
    _local_2740 = auVar92;
    local_1a40 = local_1a80;
    uStack_1a38 = uStack_1a78;
    uStack_1a30 = uStack_1a70;
    uStack_1a28 = uStack_1a68;
    uStack_1a20 = uStack_1a60;
    uStack_1a18 = uStack_1a58;
    uStack_1a10 = uStack_1a50;
    uStack_1a08 = uStack_1a48;
    local_e42 = local_27c2;
    local_e40 = local_ec0;
    uStack_e38 = uStack_eb8;
    uStack_e30 = uStack_eb0;
    uStack_e28 = uStack_ea8;
    uStack_e20 = uStack_ea0;
    uStack_e18 = uStack_e98;
    uStack_e10 = uStack_e90;
    uStack_e08 = uStack_e88;
  }
  while( true ) {
    auVar89 = _local_2060;
    local_2060._0_4_ = local_37a0._0_4_;
    uVar80 = local_2060._0_4_;
    local_2060._4_4_ = local_37a0._4_4_;
    uVar81 = local_2060._4_4_;
    fStack_2058 = local_37a0._8_4_;
    fVar95 = fStack_2058;
    fStack_2054 = local_37a0._12_4_;
    fVar97 = fStack_2054;
    fStack_2050 = local_37a0._16_4_;
    fVar82 = fStack_2050;
    fStack_204c = local_37a0._20_4_;
    fVar83 = fStack_204c;
    fStack_2048 = local_37a0._24_4_;
    fVar84 = fStack_2048;
    fStack_2044 = local_37a0._28_4_;
    fVar85 = fStack_2044;
    if (local_3514 <= local_37c4 + 7) break;
    local_3250 = local_37c0;
    auVar76 = *(undefined1 (*) [24])*local_37c0;
    uStack_23c8 = *(undefined8 *)(*local_37c0 + 0x18);
    local_3860 = auVar76._0_8_;
    local_23e0 = local_3860;
    uStack_3858 = auVar76._8_8_;
    uStack_23d8 = uStack_3858;
    uStack_3850 = auVar76._16_8_;
    uStack_23d0 = uStack_3850;
    local_2400 = local_35a0._0_8_;
    uStack_23f8 = local_35a0._8_8_;
    uStack_23f0 = local_35a0._16_8_;
    uStack_23e8 = uStack_3588;
    auVar89 = vsubps_avx(*(undefined1 (*) [32])*local_37c0,_local_35a0);
    local_3860 = auVar89._0_8_;
    uStack_3858 = auVar89._8_8_;
    uStack_3850 = auVar89._16_8_;
    uStack_3848 = auVar89._24_8_;
    local_a20 = 0;
    uStack_a18 = 0;
    uStack_a10 = 0;
    uStack_a08 = 0;
    local_2360 = 0x3f800000;
    uStack_235c = 0x3f800000;
    uStack_2358 = 0x3f800000;
    uStack_2354 = 0x3f800000;
    uStack_2350 = 0x3f800000;
    uStack_234c = 0x3f800000;
    uStack_2348 = 0x3f800000;
    uStack_2344 = 0x3f800000;
    local_9e0 = local_3860;
    uStack_9d8 = uStack_3858;
    uStack_9d0 = uStack_3850;
    uStack_9c8 = uStack_3848;
    local_a00 = 0x42b0c0a5;
    uStack_9fc = 0x42b0c0a5;
    uStack_9f8 = 0x42b0c0a5;
    uStack_9f4 = 0x42b0c0a5;
    uStack_9f0 = 0x42b0c0a5;
    uStack_9ec = 0x42b0c0a5;
    uStack_9e8 = 0x42b0c0a5;
    uStack_9e4 = 0x42b0c0a5;
    auVar96._8_4_ = 0x42b0c0a5;
    auVar96._0_8_ = 0x42b0c0a542b0c0a5;
    auVar96._12_4_ = 0x42b0c0a5;
    auVar96._16_4_ = 0x42b0c0a5;
    auVar96._20_4_ = 0x42b0c0a5;
    auVar96._24_4_ = 0x42b0c0a5;
    auVar96._28_4_ = 0x42b0c0a5;
    auVar89 = vminps_avx(auVar89,auVar96);
    local_22e0._0_8_ = auVar89._0_8_;
    local_22a0 = local_22e0._0_8_;
    local_22e0._8_8_ = auVar89._8_8_;
    uStack_2298 = local_22e0._8_8_;
    local_22e0._16_8_ = auVar89._16_8_;
    uStack_2290 = local_22e0._16_8_;
    local_22e0._24_8_ = auVar89._24_8_;
    uStack_2288 = local_22e0._24_8_;
    local_22c0 = 0xc2b0c0a5;
    uStack_22bc = 0xc2b0c0a5;
    uStack_22b8 = 0xc2b0c0a5;
    uStack_22b4 = 0xc2b0c0a5;
    uStack_22b0 = 0xc2b0c0a5;
    uStack_22ac = 0xc2b0c0a5;
    uStack_22a8 = 0xc2b0c0a5;
    uStack_22a4 = 0xc2b0c0a5;
    auVar20._8_4_ = 0xc2b0c0a5;
    auVar20._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar20._12_4_ = 0xc2b0c0a5;
    auVar20._16_4_ = 0xc2b0c0a5;
    auVar20._20_4_ = 0xc2b0c0a5;
    auVar20._24_4_ = 0xc2b0c0a5;
    auVar20._28_4_ = 0xc2b0c0a5;
    auVar19 = vmaxps_avx(auVar89,auVar20);
    local_9a8 = local_22e0;
    local_910 = ::_ps256_cephes_LOG2EF;
    local_918 = ::_ps256_0p5;
    local_22e0._0_8_ = auVar19._0_8_;
    local_780 = local_22e0._0_8_;
    local_22e0._8_8_ = auVar19._8_8_;
    uStack_778 = local_22e0._8_8_;
    local_22e0._16_8_ = auVar19._16_8_;
    uStack_770 = local_22e0._16_8_;
    local_22e0._24_8_ = auVar19._24_8_;
    uStack_768 = local_22e0._24_8_;
    local_7a0[0] = 1.442695;
    local_7a0[1] = 1.442695;
    afStack_798[0] = 1.442695;
    afStack_798[1] = 1.442695;
    afStack_790[0] = 1.442695;
    afStack_790[1] = 1.442695;
    afStack_788[0] = 1.442695;
    afStack_788[1] = 1.442695;
    local_7c0[0] = 0.5;
    local_7c0[1] = 0.5;
    afStack_7b8[0] = 0.5;
    afStack_7b8[1] = 0.5;
    afStack_7b0[0] = 0.5;
    afStack_7b0[1] = 0.5;
    afStack_7a8[0] = 0.5;
    afStack_7a8[1] = 0.5;
    auVar52._8_4_ = 1.442695;
    auVar52._12_4_ = 1.442695;
    auVar52._0_4_ = 1.442695;
    auVar52._4_4_ = 1.442695;
    auVar52._16_4_ = 1.442695;
    auVar52._20_4_ = 1.442695;
    auVar52._24_4_ = 1.442695;
    auVar52._28_4_ = 1.442695;
    auVar51._8_4_ = 0.5;
    auVar51._12_4_ = 0.5;
    auVar51._0_4_ = 0.5;
    auVar51._4_4_ = 0.5;
    auVar51._16_4_ = 0.5;
    auVar51._20_4_ = 0.5;
    auVar51._24_4_ = 0.5;
    auVar51._28_4_ = 0.5;
    auVar17 = vfmadd213ps_fma(auVar52,auVar19,auVar51);
    auVar20 = vroundps_avx(ZEXT1632(auVar17),1);
    auVar89 = vcmpps_avx(ZEXT1632(auVar17),auVar20,1);
    local_2380._0_8_ = auVar89._0_8_;
    local_8e0 = local_2380._0_8_;
    local_2380._8_8_ = auVar89._8_8_;
    uStack_8d8 = local_2380._8_8_;
    local_2380._16_8_ = auVar89._16_8_;
    uStack_8d0 = local_2380._16_8_;
    local_2380._24_8_ = auVar89._24_8_;
    uStack_8c8 = local_2380._24_8_;
    local_900 = 0x3f8000003f800000;
    uStack_8f8 = 0x3f8000003f800000;
    uStack_8f0 = 0x3f8000003f800000;
    uStack_8e8 = 0x3f8000003f800000;
    auVar50._8_8_ = 0x3f8000003f800000;
    auVar50._0_8_ = 0x3f8000003f800000;
    auVar50._16_8_ = 0x3f8000003f800000;
    auVar50._24_8_ = 0x3f8000003f800000;
    local_2380 = vpand_avx2(auVar89,auVar50);
    local_2300 = auVar20._0_8_;
    local_2260 = local_2300;
    uStack_22f8 = auVar20._8_8_;
    uStack_2258 = uStack_22f8;
    uStack_22f0 = auVar20._16_8_;
    uStack_2250 = uStack_22f0;
    uStack_22e8 = auVar20._24_8_;
    uStack_2248 = uStack_22e8;
    local_2280 = local_2380._0_8_;
    uStack_2278 = local_2380._8_8_;
    uStack_2270 = local_2380._16_8_;
    uStack_2268 = local_2380._24_8_;
    local_2320 = vsubps_avx(auVar20,local_2380);
    local_8a0 = local_2320;
    local_890 = ::_ps256_cephes_exp_C1;
    local_4e0 = local_2320._0_8_;
    uStack_4d8 = local_2320._8_8_;
    uStack_4d0 = local_2320._16_8_;
    uStack_4c8 = local_2320._24_8_;
    local_500[0] = 0.6933594;
    local_500[1] = 0.6933594;
    afStack_4f8[0] = 0.6933594;
    afStack_4f8[1] = 0.6933594;
    afStack_4f0[0] = 0.6933594;
    afStack_4f0[1] = 0.6933594;
    afStack_4e8[0] = 0.6933594;
    afStack_4e8[1] = 0.6933594;
    local_520 = local_22e0._0_8_;
    uStack_518 = local_22e0._8_8_;
    uStack_510 = local_22e0._16_8_;
    uStack_508 = local_22e0._24_8_;
    auVar58._8_4_ = 0.6933594;
    auVar58._12_4_ = 0.6933594;
    auVar58._0_4_ = 0.6933594;
    auVar58._4_4_ = 0.6933594;
    auVar58._16_4_ = 0.6933594;
    auVar58._20_4_ = 0.6933594;
    auVar58._24_4_ = 0.6933594;
    auVar58._28_4_ = 0.6933594;
    auVar17 = vfnmadd213ps_fma(auVar58,local_2320,auVar19);
    local_8a8 = ::_ps256_cephes_exp_C2;
    local_480 = local_2320._0_8_;
    uStack_478 = local_2320._8_8_;
    uStack_470 = local_2320._16_8_;
    uStack_468 = local_2320._24_8_;
    local_4a0[0] = -0.00021219444;
    local_4a0[1] = -0.00021219444;
    afStack_498[0] = -0.00021219444;
    afStack_498[1] = -0.00021219444;
    afStack_490[0] = -0.00021219444;
    afStack_490[1] = -0.00021219444;
    afStack_488[0] = -0.00021219444;
    afStack_488[1] = -0.00021219444;
    local_22e0._0_8_ = auVar17._0_8_;
    local_4c0 = local_22e0._0_8_;
    local_22e0._8_8_ = auVar17._8_8_;
    uStack_4b8 = local_22e0._8_8_;
    uStack_4b0 = 0;
    uStack_4a8 = 0;
    auVar59._8_4_ = -0.00021219444;
    auVar59._12_4_ = -0.00021219444;
    auVar59._0_4_ = -0.00021219444;
    auVar59._4_4_ = -0.00021219444;
    auVar59._16_4_ = -0.00021219444;
    auVar59._20_4_ = -0.00021219444;
    auVar59._24_4_ = -0.00021219444;
    auVar59._28_4_ = -0.00021219444;
    auVar17 = vfnmadd213ps_fma(auVar59,local_2320,ZEXT1632(auVar17));
    auVar96 = ZEXT1632(auVar17);
    local_22e0._0_8_ = auVar17._0_8_;
    local_1940 = local_22e0._0_8_;
    local_22e0._8_8_ = auVar17._8_8_;
    uStack_1938 = local_22e0._8_8_;
    uStack_1930 = 0;
    uStack_1928 = 0;
    local_1920._0_4_ = auVar17._0_4_;
    local_1920._4_4_ = auVar17._4_4_;
    uStack_1918._0_4_ = auVar17._8_4_;
    uStack_1918._4_4_ = auVar17._12_4_;
    local_2300._4_4_ = local_1920._4_4_ * local_1920._4_4_;
    local_2300._0_4_ = (float)local_1920 * (float)local_1920;
    local_560 = local_2300;
    uStack_22f8._0_4_ = (float)uStack_1918 * (float)uStack_1918;
    uStack_22f8._4_4_ = uStack_1918._4_4_ * uStack_1918._4_4_;
    auVar16 = _local_2300;
    _local_2300 = ZEXT1632(_local_2300);
    auVar20 = _local_2300;
    uStack_2398._0_4_ = 0x39506967;
    local_23a0 = (undefined1  [8])0x3950696739506967;
    uStack_2398._4_4_ = 0x39506967;
    uStack_2390._0_4_ = 0x39506967;
    uStack_2390._4_4_ = 0x39506967;
    auVar76 = _local_23a0;
    uStack_2388._0_4_ = 0x39506967;
    uStack_2388._4_4_ = 0x39506967;
    auVar89 = _local_23a0;
    local_998 = local_23a0;
    local_930 = ::_ps256_cephes_exp_p1;
    local_720 = 0x3950696739506967;
    uStack_718 = uStack_2398;
    uStack_2390 = auVar76._16_8_;
    uStack_710 = uStack_2390;
    uStack_2388 = auVar89._24_8_;
    uStack_708 = uStack_2388;
    local_740 = local_22e0._0_8_;
    uStack_738 = local_22e0._8_8_;
    uStack_730 = 0;
    uStack_728 = 0;
    local_760[0] = 0.0013981999;
    local_760[1] = 0.0013981999;
    afStack_758[0] = 0.0013981999;
    afStack_758[1] = 0.0013981999;
    afStack_750[0] = 0.0013981999;
    afStack_750[1] = 0.0013981999;
    afStack_748[0] = 0.0013981999;
    afStack_748[1] = 0.0013981999;
    auVar53._8_4_ = 0.0013981999;
    auVar53._12_4_ = 0.0013981999;
    auVar53._0_4_ = 0.0013981999;
    auVar53._4_4_ = 0.0013981999;
    auVar53._16_4_ = 0.0013981999;
    auVar53._20_4_ = 0.0013981999;
    auVar53._24_4_ = 0.0013981999;
    auVar53._28_4_ = 0.0013981999;
    auVar17 = vfmadd213ps_fma(auVar96,auVar89,auVar53);
    local_948 = ::_ps256_cephes_exp_p2;
    local_23a0 = auVar17._0_8_;
    local_6c0 = local_23a0;
    uStack_2398 = auVar17._8_8_;
    uStack_6b8 = uStack_2398;
    uStack_6b0 = 0;
    uStack_6a8 = 0;
    local_6e0 = local_22e0._0_8_;
    uStack_6d8 = local_22e0._8_8_;
    uStack_6d0 = 0;
    uStack_6c8 = 0;
    local_700[0] = 0.008333452;
    local_700[1] = 0.008333452;
    afStack_6f8[0] = 0.008333452;
    afStack_6f8[1] = 0.008333452;
    afStack_6f0[0] = 0.008333452;
    afStack_6f0[1] = 0.008333452;
    afStack_6e8[0] = 0.008333452;
    afStack_6e8[1] = 0.008333452;
    auVar54._8_4_ = 0.008333452;
    auVar54._12_4_ = 0.008333452;
    auVar54._0_4_ = 0.008333452;
    auVar54._4_4_ = 0.008333452;
    auVar54._16_4_ = 0.008333452;
    auVar54._20_4_ = 0.008333452;
    auVar54._24_4_ = 0.008333452;
    auVar54._28_4_ = 0.008333452;
    auVar17 = vfmadd213ps_fma(auVar96,ZEXT1632(auVar17),auVar54);
    local_960 = ::_ps256_cephes_exp_p3;
    local_23a0 = auVar17._0_8_;
    local_660 = local_23a0;
    uStack_2398 = auVar17._8_8_;
    uStack_658 = uStack_2398;
    uStack_650 = 0;
    uStack_648 = 0;
    local_680 = local_22e0._0_8_;
    uStack_678 = local_22e0._8_8_;
    uStack_670 = 0;
    uStack_668 = 0;
    local_6a0[0] = 0.041665796;
    local_6a0[1] = 0.041665796;
    afStack_698[0] = 0.041665796;
    afStack_698[1] = 0.041665796;
    afStack_690[0] = 0.041665796;
    afStack_690[1] = 0.041665796;
    afStack_688[0] = 0.041665796;
    afStack_688[1] = 0.041665796;
    auVar55._8_4_ = 0.041665796;
    auVar55._12_4_ = 0.041665796;
    auVar55._0_4_ = 0.041665796;
    auVar55._4_4_ = 0.041665796;
    auVar55._16_4_ = 0.041665796;
    auVar55._20_4_ = 0.041665796;
    auVar55._24_4_ = 0.041665796;
    auVar55._28_4_ = 0.041665796;
    auVar17 = vfmadd213ps_fma(auVar96,ZEXT1632(auVar17),auVar55);
    local_978 = ::_ps256_cephes_exp_p4;
    local_23a0 = auVar17._0_8_;
    local_600 = local_23a0;
    uStack_2398 = auVar17._8_8_;
    uStack_5f8 = uStack_2398;
    uStack_5f0 = 0;
    uStack_5e8 = 0;
    local_620 = local_22e0._0_8_;
    uStack_618 = local_22e0._8_8_;
    uStack_610 = 0;
    uStack_608 = 0;
    local_640[0] = 0.16666666;
    local_640[1] = 0.16666666;
    afStack_638[0] = 0.16666666;
    afStack_638[1] = 0.16666666;
    afStack_630[0] = 0.16666666;
    afStack_630[1] = 0.16666666;
    afStack_628[0] = 0.16666666;
    afStack_628[1] = 0.16666666;
    auVar56._8_4_ = 0.16666666;
    auVar56._12_4_ = 0.16666666;
    auVar56._0_4_ = 0.16666666;
    auVar56._4_4_ = 0.16666666;
    auVar56._16_4_ = 0.16666666;
    auVar56._20_4_ = 0.16666666;
    auVar56._24_4_ = 0.16666666;
    auVar56._28_4_ = 0.16666666;
    auVar17 = vfmadd213ps_fma(auVar96,ZEXT1632(auVar17),auVar56);
    local_990 = ::_ps256_cephes_exp_p5;
    local_23a0 = auVar17._0_8_;
    local_5a0 = local_23a0;
    uStack_2398 = auVar17._8_8_;
    uStack_598 = uStack_2398;
    uStack_590 = 0;
    uStack_588 = 0;
    local_5c0 = local_22e0._0_8_;
    uStack_5b8 = local_22e0._8_8_;
    uStack_5b0 = 0;
    uStack_5a8 = 0;
    local_5e0[0] = 0.5;
    local_5e0[1] = 0.5;
    afStack_5d8[0] = 0.5;
    afStack_5d8[1] = 0.5;
    afStack_5d0[0] = 0.5;
    afStack_5d0[1] = 0.5;
    afStack_5c8[0] = 0.5;
    afStack_5c8[1] = 0.5;
    auVar57._8_4_ = 0.5;
    auVar57._12_4_ = 0.5;
    auVar57._0_4_ = 0.5;
    auVar57._4_4_ = 0.5;
    auVar57._16_4_ = 0.5;
    auVar57._20_4_ = 0.5;
    auVar57._24_4_ = 0.5;
    auVar57._28_4_ = 0.5;
    auVar17 = vfmadd213ps_fma(auVar96,ZEXT1632(auVar17),auVar57);
    local_9a0 = local_2300;
    local_23a0 = auVar17._0_8_;
    local_540 = local_23a0;
    uStack_2398 = auVar17._8_8_;
    uStack_538 = uStack_2398;
    uStack_530 = 0;
    uStack_528 = 0;
    uStack_22f8 = auVar16._8_8_;
    uStack_558 = uStack_22f8;
    uStack_550 = 0;
    uStack_548 = 0;
    local_580 = local_22e0._0_8_;
    uStack_578 = local_22e0._8_8_;
    uStack_570 = 0;
    uStack_568 = 0;
    auVar17 = vfmadd213ps_fma(auVar20,ZEXT1632(auVar17),auVar96);
    local_23a0 = auVar17._0_8_;
    uVar21 = local_23a0;
    uStack_2398 = auVar17._8_8_;
    uVar22 = uStack_2398;
    uStack_2190 = 0;
    uStack_2188 = 0;
    local_21c0 = 0x3f8000003f800000;
    uStack_21b8 = 0x3f8000003f800000;
    uStack_21b0 = 0x3f8000003f800000;
    uStack_21a8 = 0x3f8000003f800000;
    local_21a0._0_4_ = auVar17._0_4_;
    local_21a0._4_4_ = auVar17._4_4_;
    uStack_2198._0_4_ = auVar17._8_4_;
    uStack_2198._4_4_ = auVar17._12_4_;
    local_23a0._4_4_ = local_21a0._4_4_ + 1.0;
    local_23a0._0_4_ = (float)local_21a0 + 1.0;
    uStack_2398._0_4_ = (float)uStack_2198 + 1.0;
    uStack_2398._4_4_ = uStack_2198._4_4_ + 1.0;
    uStack_2390._0_4_ = 0x3f800000;
    uStack_2390._4_4_ = 0x3f800000;
    auVar76 = _local_23a0;
    uStack_2388._0_4_ = 0x3f800000;
    uStack_2388._4_4_ = 0x3f800000;
    auVar19 = _local_23a0;
    local_880._0_4_ = local_2320._0_4_;
    local_880._4_4_ = local_2320._4_4_;
    uStack_878._0_4_ = local_2320._8_4_;
    uStack_878._4_4_ = local_2320._12_4_;
    uStack_870._0_4_ = local_2320._16_4_;
    uStack_870._4_4_ = local_2320._20_4_;
    uStack_868._0_4_ = local_2320._24_4_;
    uStack_868._4_4_ = local_2320._28_4_;
    local_2340._4_4_ = (int)local_880._4_4_;
    local_2340._0_4_ = (int)(float)local_880;
    local_2340._8_4_ = (int)(float)uStack_878;
    local_2340._12_4_ = (int)uStack_878._4_4_;
    local_2340._16_4_ = (int)(float)uStack_870;
    local_2340._20_4_ = (int)uStack_870._4_4_;
    auVar79 = local_2340._0_24_;
    local_2340._24_4_ = (int)(float)uStack_868;
    local_2340._28_4_ = (int)uStack_868._4_4_;
    auVar89 = local_2340;
    local_840 = local_2340._0_8_;
    uStack_838 = local_2340._8_8_;
    local_2340._16_8_ = auVar79._16_8_;
    uStack_830 = local_2340._16_8_;
    local_2340._24_8_ = auVar89._24_8_;
    uStack_828 = local_2340._24_8_;
    local_860 = 0x7f0000007f;
    uStack_858 = 0x7f0000007f;
    uStack_850 = 0x7f0000007f;
    uStack_848 = 0x7f0000007f;
    local_440 = local_2340._0_8_;
    uStack_438 = local_2340._8_8_;
    uStack_430 = local_2340._16_8_;
    uStack_428 = local_2340._24_8_;
    local_460 = 0x7f0000007f;
    uStack_458 = 0x7f0000007f;
    uStack_450 = 0x7f0000007f;
    uStack_448 = 0x7f0000007f;
    auVar61._16_8_ = local_2340._16_8_;
    auVar61._0_16_ = local_2340._0_16_;
    auVar61._24_8_ = local_2340._24_8_;
    auVar60._8_8_ = 0x7f0000007f;
    auVar60._0_8_ = 0x7f0000007f;
    auVar60._16_8_ = 0x7f0000007f;
    auVar60._24_8_ = 0x7f0000007f;
    auVar89 = vpaddd_avx2(auVar61,auVar60);
    local_2340._0_8_ = auVar89._0_8_;
    local_800 = local_2340._0_8_;
    local_2340._8_8_ = auVar89._8_8_;
    uStack_7f8 = local_2340._8_8_;
    local_2340._16_8_ = auVar89._16_8_;
    uStack_7f0 = local_2340._16_8_;
    local_2340._24_8_ = auVar89._24_8_;
    uStack_7e8 = local_2340._24_8_;
    local_804 = 0x17;
    local_400 = local_2340._0_8_;
    uStack_3f8 = local_2340._8_8_;
    uStack_3f0 = local_2340._16_8_;
    uStack_3e8 = local_2340._24_8_;
    local_404 = 0x17;
    local_2340 = vpslld_avx2(auVar89,ZEXT416(0x17));
    local_7e0 = local_2340._0_8_;
    uStack_7d8 = local_2340._8_8_;
    uStack_7d0 = local_2340._16_8_;
    uStack_7c8 = local_2340._24_8_;
    local_23c0 = local_2340._0_8_;
    uStack_23b8 = local_2340._8_8_;
    uStack_23b0 = local_2340._16_8_;
    uStack_23a8 = local_2340._24_8_;
    local_1960 = local_23a0;
    uStack_1958 = uStack_2398;
    uStack_2390 = auVar76._16_8_;
    uStack_1950 = uStack_2390;
    uStack_2388 = auVar19._24_8_;
    uStack_1948 = uStack_2388;
    local_1980._0_4_ = local_2340._0_4_;
    local_1980._4_4_ = local_2340._4_4_;
    uStack_1978._0_4_ = local_2340._8_4_;
    uStack_1978._4_4_ = local_2340._12_4_;
    uStack_1970._0_4_ = local_2340._16_4_;
    uStack_1970._4_4_ = local_2340._20_4_;
    uStack_1968._0_4_ = local_2340._24_4_;
    local_23a0._0_4_ = ((float)local_21a0 + 1.0) * (float)local_1980;
    local_23a0._4_4_ = (local_21a0._4_4_ + 1.0) * local_1980._4_4_;
    uStack_1978._0_4_ = ((float)uStack_2198 + 1.0) * (float)uStack_1978;
    uStack_1978._4_4_ = (uStack_2198._4_4_ + 1.0) * uStack_1978._4_4_;
    uStack_2398._0_4_ = (float)uStack_1978;
    uStack_2398._4_4_ = uStack_1978._4_4_;
    uStack_2390._0_4_ = (float)uStack_1970 * 1.0;
    uStack_2390._4_4_ = uStack_1970._4_4_ * 1.0;
    auVar76 = _local_23a0;
    uStack_2388._0_4_ = (float)uStack_1968 * 1.0;
    uStack_2388._4_4_ = 0x3f800000;
    auVar19 = _local_23a0;
    uStack_2390 = auVar76._16_8_;
    uStack_2388 = auVar19._24_8_;
    local_21c8 = local_37c0;
    local_2200 = local_23a0;
    uStack_21f8 = uStack_2398;
    uStack_21f0 = uStack_2390;
    uStack_21e8 = uStack_2388;
    *(undefined1 (*) [8])*local_37c0 = local_23a0;
    *(undefined8 *)(*local_37c0 + 8) = uStack_2398;
    *(undefined8 *)(*local_37c0 + 0x10) = uStack_2390;
    *(undefined8 *)(*local_37c0 + 0x18) = uStack_2388;
    auVar89 = _local_37a0;
    local_2080 = local_23a0;
    uStack_2078 = uStack_2398;
    uStack_2070 = uStack_2390;
    uStack_2068 = uStack_2388;
    local_37a0._4_4_ = (float)local_2060._4_4_ + (float)local_23a0._4_4_;
    local_37a0._0_4_ = (float)local_2060._0_4_ + (float)local_23a0._0_4_;
    uStack_3798._0_4_ = fStack_2058 + (float)uStack_1978;
    uStack_3798._4_4_ = fStack_2054 + uStack_1978._4_4_;
    auStack_3790._0_4_ = fStack_2050 + (float)uStack_1970 * 1.0;
    auStack_3790._4_4_ = fStack_204c + uStack_1970._4_4_ * 1.0;
    uStack_3788._0_4_ = fStack_2048 + (float)uStack_1968 * 1.0;
    uStack_3788._4_4_ = fStack_2044 + 1.0;
    local_37c0 = (undefined1 (*) [64])(*local_37c0 + 0x20);
    local_37c4 = local_37c4 + 8;
    _local_23a0 = auVar19;
    _local_2300 = auVar20;
    local_22e0 = auVar96;
    local_21a0 = uVar21;
    uStack_2198 = uVar22;
    _local_2060 = auVar89;
    local_1980 = local_2340._0_8_;
    uStack_1978 = local_2340._8_8_;
    uStack_1970 = local_2340._16_8_;
    uStack_1968 = local_2340._24_8_;
    local_1920 = local_1940;
    uStack_1918 = uStack_1938;
    uStack_1910 = uStack_1930;
    uStack_1908 = uStack_1928;
    local_988 = local_9a8;
    local_980 = local_998;
    local_970 = local_9a8;
    local_968 = local_998;
    local_958 = local_9a8;
    local_950 = local_998;
    local_940 = local_9a8;
    local_938 = local_998;
    local_928 = local_9a8;
    local_920 = local_998;
    local_908 = local_9a8;
    local_8b0 = local_9a8;
    local_898 = local_9a8;
    local_888 = local_8a0;
    local_880 = local_2320._0_8_;
    uStack_878 = local_2320._8_8_;
    uStack_870 = local_2320._16_8_;
    uStack_868 = local_2320._24_8_;
  }
  while( true ) {
    auVar17 = _local_1e90;
    local_1e90._0_4_ = local_37b0._0_4_;
    uVar86 = local_1e90._0_4_;
    local_1e90._4_4_ = local_37b0._4_4_;
    uVar87 = local_1e90._4_4_;
    fStack_1e88 = local_37b0._8_4_;
    fVar98 = fStack_1e88;
    fStack_1e84 = local_37b0._12_4_;
    fVar99 = fStack_1e84;
    _local_2060 = auVar89;
    if (local_3514 <= local_37c4 + 3) break;
    local_30f0 = local_37c0;
    local_2030 = *(undefined8 *)*local_37c0;
    uStack_2028 = *(undefined8 *)(*local_37c0 + 8);
    local_2040 = local_35b0._0_8_;
    uStack_2038 = local_35b0._8_8_;
    auVar17 = vsubps_avx(*(undefined1 (*) [16])*local_37c0,local_35b0);
    local_3870 = auVar17._0_8_;
    uStack_3868 = auVar17._8_8_;
    local_3e0 = (undefined1  [16])0x0;
    local_1ff0 = 0x3f800000;
    uStack_1fec = 0x3f800000;
    uStack_1fe8 = 0x3f800000;
    uStack_1fe4 = 0x3f800000;
    local_3c0 = local_3870;
    uStack_3b8 = uStack_3868;
    local_3d0 = 0x42b0c0a5;
    uStack_3cc = 0x42b0c0a5;
    uStack_3c8 = 0x42b0c0a5;
    uStack_3c4 = 0x42b0c0a5;
    auVar62._8_4_ = 0x42b0c0a5;
    auVar62._0_8_ = 0x42b0c0a542b0c0a5;
    auVar62._12_4_ = 0x42b0c0a5;
    auVar17 = vminps_avx(auVar17,auVar62);
    local_1fb0._0_8_ = auVar17._0_8_;
    local_1f90 = local_1fb0._0_8_;
    local_1fb0._8_8_ = auVar17._8_8_;
    uStack_1f88 = local_1fb0._8_8_;
    local_1fa0 = 0xc2b0c0a5;
    uStack_1f9c = 0xc2b0c0a5;
    uStack_1f98 = 0xc2b0c0a5;
    uStack_1f94 = 0xc2b0c0a5;
    auVar27._8_4_ = 0xc2b0c0a5;
    auVar27._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar27._12_4_ = 0xc2b0c0a5;
    auVar18 = vmaxps_avx(auVar17,auVar27);
    local_1fb0._0_8_ = auVar18._0_8_;
    uVar21 = local_1fb0._0_8_;
    local_1fb0._8_8_ = auVar18._8_8_;
    uVar22 = local_1fb0._8_8_;
    local_1880 = 0x3fb8aa3b;
    uStack_187c = 0x3fb8aa3b;
    uStack_1878 = 0x3fb8aa3b;
    uStack_1874 = 0x3fb8aa3b;
    local_1870._0_4_ = auVar18._0_4_;
    local_1870._4_4_ = auVar18._4_4_;
    uStack_1868._0_4_ = auVar18._8_4_;
    uStack_1868._4_4_ = auVar18._12_4_;
    local_1fd0._4_4_ = local_1870._4_4_ * 1.442695;
    local_1fd0._0_4_ = (float)local_1870 * 1.442695;
    uStack_1fc8._0_4_ = (float)uStack_1868 * 1.442695;
    uStack_1fc8._4_4_ = uStack_1868._4_4_ * 1.442695;
    local_1ef0 = local_1fd0;
    uStack_1ee8 = uStack_1fc8;
    local_1f00 = 0x3f000000;
    uStack_1efc = 0x3f000000;
    uStack_1ef8 = 0x3f000000;
    uStack_1ef4 = 0x3f000000;
    local_1fd0._0_4_ = (float)local_1870 * 1.442695 + 0.5;
    local_1fd0._4_4_ = local_1870._4_4_ * 1.442695 + 0.5;
    fVar98 = (float)uStack_1868 * 1.442695 + 0.5;
    fVar99 = uStack_1868._4_4_ * 1.442695 + 0.5;
    uStack_1fc8._0_4_ = fVar98;
    uStack_1fc8._4_4_ = fVar99;
    local_3a0 = local_1fd0;
    uStack_398 = uStack_1fc8;
    local_1fe0._4_4_ = (int)(float)local_1fd0._4_4_;
    local_1fe0._0_4_ = (int)(float)local_1fd0._0_4_;
    local_1fe0._8_4_ = (int)fVar98;
    local_1fe0._12_4_ = (int)fVar99;
    local_390 = local_1fe0._0_8_;
    uStack_388 = local_1fe0._8_8_;
    auVar63._8_8_ = local_1fe0._8_8_;
    auVar63._0_8_ = local_1fe0._0_8_;
    auVar16 = vcvtdq2ps_avx(auVar63);
    local_1fc0 = auVar16._0_8_;
    local_370 = local_1fc0;
    uStack_1fb8 = auVar16._8_8_;
    uStack_368 = uStack_1fb8;
    local_380 = local_1fd0;
    uStack_378 = uStack_1fc8;
    auVar64._8_8_ = uStack_1fc8;
    auVar64._0_8_ = local_1fd0;
    auVar17 = vcmpps_avx(auVar64,auVar16,1);
    local_2000._0_8_ = auVar17._0_8_;
    local_350 = local_2000._0_8_;
    local_2000._8_8_ = auVar17._8_8_;
    uStack_348 = local_2000._8_8_;
    local_360 = 0x3f8000003f800000;
    uStack_358 = 0x3f8000003f800000;
    auVar65._8_8_ = 0x3f8000003f800000;
    auVar65._0_8_ = 0x3f8000003f800000;
    local_2000 = vpand_avx(auVar17,auVar65);
    local_1f70 = local_1fc0;
    uStack_1f68 = uStack_1fb8;
    local_1f80 = local_2000._0_8_;
    uStack_1f78 = local_2000._8_8_;
    _local_1fd0 = vsubps_avx(auVar16,local_2000);
    local_330 = local_1fd0;
    local_320 = ::_ps_cephes_exp_C1;
    local_340 = local_1fb0;
    local_210 = local_1fd0;
    uStack_208 = uStack_1fc8;
    local_220[0] = 0.6933594;
    local_220[1] = 0.6933594;
    afStack_218[0] = 0.6933594;
    afStack_218[1] = 0.6933594;
    local_230 = local_1fb0._0_8_;
    uStack_228 = local_1fb0._8_8_;
    auVar68._8_4_ = 0.6933594;
    auVar68._12_4_ = 0.6933594;
    auVar68._0_4_ = 0.6933594;
    auVar68._4_4_ = 0.6933594;
    auVar17 = vfnmadd213ps_fma(auVar68,_local_1fd0,auVar18);
    local_338 = ::_ps_cephes_exp_C2;
    local_1e0 = local_1fd0;
    uStack_1d8 = uStack_1fc8;
    local_1f0[0] = -0.00021219444;
    local_1f0[1] = -0.00021219444;
    afStack_1e8[0] = -0.00021219444;
    afStack_1e8[1] = -0.00021219444;
    local_1fb0._0_8_ = auVar17._0_8_;
    local_200 = local_1fb0._0_8_;
    local_1fb0._8_8_ = auVar17._8_8_;
    uStack_1f8 = local_1fb0._8_8_;
    auVar69._8_4_ = -0.00021219444;
    auVar69._12_4_ = -0.00021219444;
    auVar69._0_4_ = -0.00021219444;
    auVar69._4_4_ = -0.00021219444;
    local_1fb0 = vfnmadd213ps_fma(auVar69,_local_1fd0,auVar17);
    local_18a0 = local_1fb0._0_8_;
    uStack_1898 = local_1fb0._8_8_;
    local_1890._0_4_ = local_1fb0._0_4_;
    local_1890._4_4_ = local_1fb0._4_4_;
    uStack_1888._0_4_ = local_1fb0._8_4_;
    uStack_1888._4_4_ = local_1fb0._12_4_;
    local_1fc0._4_4_ = local_1890._4_4_ * local_1890._4_4_;
    local_1fc0._0_4_ = (float)local_1890 * (float)local_1890;
    uStack_1fb8._0_4_ = (float)uStack_1888 * (float)uStack_1888;
    uStack_1fb8._4_4_ = uStack_1888._4_4_ * uStack_1888._4_4_;
    uStack_2008._0_4_ = 0x39506967;
    local_2010 = (undefined1  [8])0x3950696739506967;
    uStack_2008._4_4_ = 0x39506967;
    local_300 = local_2010;
    local_298 = ::_ps_cephes_exp_p1;
    local_1b0 = 0x3950696739506967;
    uStack_1a8 = uStack_2008;
    local_1c0 = local_1fb0._0_8_;
    uStack_1b8 = local_1fb0._8_8_;
    local_1d0[0] = 0.0013981999;
    local_1d0[1] = 0.0013981999;
    afStack_1c8[0] = 0.0013981999;
    afStack_1c8[1] = 0.0013981999;
    auVar70._8_4_ = 0.0013981999;
    auVar70._12_4_ = 0.0013981999;
    auVar70._0_4_ = 0.0013981999;
    auVar70._4_4_ = 0.0013981999;
    auVar17 = vfmadd213ps_fma(local_1fb0,_local_2010,auVar70);
    local_2b0 = ::_ps_cephes_exp_p2;
    local_2010 = auVar17._0_8_;
    local_180 = local_2010;
    uStack_2008 = auVar17._8_8_;
    uStack_178 = uStack_2008;
    local_190 = local_1fb0._0_8_;
    uStack_188 = local_1fb0._8_8_;
    local_1a0[0] = 0.008333452;
    local_1a0[1] = 0.008333452;
    afStack_198[0] = 0.008333452;
    afStack_198[1] = 0.008333452;
    auVar71._8_4_ = 0.008333452;
    auVar71._12_4_ = 0.008333452;
    auVar71._0_4_ = 0.008333452;
    auVar71._4_4_ = 0.008333452;
    auVar17 = vfmadd213ps_fma(local_1fb0,auVar17,auVar71);
    local_2c8 = ::_ps_cephes_exp_p3;
    local_2010 = auVar17._0_8_;
    local_150 = local_2010;
    uStack_2008 = auVar17._8_8_;
    uStack_148 = uStack_2008;
    local_160 = local_1fb0._0_8_;
    uStack_158 = local_1fb0._8_8_;
    local_170[0] = 0.041665796;
    local_170[1] = 0.041665796;
    afStack_168[0] = 0.041665796;
    afStack_168[1] = 0.041665796;
    auVar72._8_4_ = 0.041665796;
    auVar72._12_4_ = 0.041665796;
    auVar72._0_4_ = 0.041665796;
    auVar72._4_4_ = 0.041665796;
    auVar17 = vfmadd213ps_fma(local_1fb0,auVar17,auVar72);
    local_2e0 = ::_ps_cephes_exp_p4;
    local_2010 = auVar17._0_8_;
    local_120 = local_2010;
    uStack_2008 = auVar17._8_8_;
    uStack_118 = uStack_2008;
    local_130 = local_1fb0._0_8_;
    uStack_128 = local_1fb0._8_8_;
    local_140[0] = 0.16666666;
    local_140[1] = 0.16666666;
    afStack_138[0] = 0.16666666;
    afStack_138[1] = 0.16666666;
    auVar73._8_4_ = 0.16666666;
    auVar73._12_4_ = 0.16666666;
    auVar73._0_4_ = 0.16666666;
    auVar73._4_4_ = 0.16666666;
    auVar17 = vfmadd213ps_fma(local_1fb0,auVar17,auVar73);
    local_2f8 = ::_ps_cephes_exp_p5;
    local_2010 = auVar17._0_8_;
    local_f0 = local_2010;
    uStack_2008 = auVar17._8_8_;
    uStack_e8 = uStack_2008;
    local_100 = local_1fb0._0_8_;
    uStack_f8 = local_1fb0._8_8_;
    local_110[0] = 0.5;
    local_110[1] = 0.5;
    afStack_108[0] = 0.5;
    afStack_108[1] = 0.5;
    auVar74._8_4_ = 0.5;
    auVar74._12_4_ = 0.5;
    auVar74._0_4_ = 0.5;
    auVar74._4_4_ = 0.5;
    auVar17 = vfmadd213ps_fma(local_1fb0,auVar17,auVar74);
    local_308 = local_1fc0;
    local_2010 = auVar17._0_8_;
    local_c0 = local_2010;
    uStack_2008 = auVar17._8_8_;
    uStack_b8 = uStack_2008;
    local_d0 = local_1fc0;
    uStack_c8 = uStack_1fb8;
    local_e0 = local_1fb0._0_8_;
    uStack_d8 = local_1fb0._8_8_;
    auVar17 = vfmadd213ps_fma(_local_1fc0,auVar17,local_1fb0);
    local_2010 = auVar17._0_8_;
    uVar23 = local_2010;
    uStack_2008 = auVar17._8_8_;
    uVar24 = uStack_2008;
    local_1f20 = 0x3f8000003f800000;
    uStack_1f18 = 0x3f8000003f800000;
    local_1f10._0_4_ = auVar17._0_4_;
    local_1f10._4_4_ = auVar17._4_4_;
    uStack_1f08._0_4_ = auVar17._8_4_;
    uStack_1f08._4_4_ = auVar17._12_4_;
    local_2010._4_4_ = local_1f10._4_4_ + 1.0;
    local_2010._0_4_ = (float)local_1f10 + 1.0;
    uStack_2008._0_4_ = (float)uStack_1f08 + 1.0;
    uStack_2008._4_4_ = uStack_1f08._4_4_ + 1.0;
    local_3b0._0_4_ = local_1fd0._0_4_;
    local_3b0._4_4_ = local_1fd0._4_4_;
    uStack_3a8._0_4_ = local_1fd0._8_4_;
    uStack_3a8._4_4_ = local_1fd0._12_4_;
    local_1fe0._4_4_ = (int)local_3b0._4_4_;
    local_1fe0._0_4_ = (int)(float)local_3b0;
    local_1fe0._8_4_ = (int)(float)uStack_3a8;
    local_1fe0._12_4_ = (int)uStack_3a8._4_4_;
    local_270 = local_1fe0._0_8_;
    uStack_268 = local_1fe0._8_8_;
    local_280 = 0x7f0000007f;
    uStack_278 = 0x7f0000007f;
    auVar67._8_8_ = local_1fe0._8_8_;
    auVar67._0_8_ = local_1fe0._0_8_;
    auVar66._8_8_ = 0x7f0000007f;
    auVar66._0_8_ = 0x7f0000007f;
    auVar17 = vpaddd_avx(auVar67,auVar66);
    local_1fe0._0_8_ = auVar17._0_8_;
    local_250 = local_1fe0._0_8_;
    local_1fe0._8_8_ = auVar17._8_8_;
    uStack_248 = local_1fe0._8_8_;
    local_254 = 0x17;
    local_1fe0 = vpslld_avx(auVar17,ZEXT416(0x17));
    local_240 = local_1fe0._0_8_;
    uStack_238 = local_1fe0._8_8_;
    local_2020 = local_1fe0._0_8_;
    uStack_2018 = local_1fe0._8_8_;
    local_18b0 = local_2010;
    uStack_18a8 = uStack_2008;
    local_18c0._0_4_ = local_1fe0._0_4_;
    local_18c0._4_4_ = local_1fe0._4_4_;
    uStack_18b8._0_4_ = local_1fe0._8_4_;
    uStack_18b8._4_4_ = local_1fe0._12_4_;
    local_2010._0_4_ = ((float)local_1f10 + 1.0) * (float)local_18c0;
    local_2010._4_4_ = (local_1f10._4_4_ + 1.0) * local_18c0._4_4_;
    uStack_18b8._0_4_ = ((float)uStack_1f08 + 1.0) * (float)uStack_18b8;
    uStack_18b8._4_4_ = (uStack_1f08._4_4_ + 1.0) * uStack_18b8._4_4_;
    uStack_2008._0_4_ = (float)uStack_18b8;
    uStack_2008._4_4_ = uStack_18b8._4_4_;
    local_1f28 = local_37c0;
    local_1f40 = local_2010;
    uStack_1f38 = uStack_2008;
    *(undefined1 (*) [8])*local_37c0 = local_2010;
    *(undefined8 *)(*local_37c0 + 8) = uStack_2008;
    auVar17 = _local_37b0;
    local_1ea0 = local_2010;
    uStack_1e98 = uStack_2008;
    local_37b0._4_4_ = (float)local_1e90._4_4_ + (float)local_2010._4_4_;
    local_37b0._0_4_ = (float)local_1e90._0_4_ + (float)local_2010._0_4_;
    uStack_37a8._0_4_ = fStack_1e88 + (float)uStack_18b8;
    uStack_37a8._4_4_ = fStack_1e84 + uStack_18b8._4_4_;
    local_37c0 = (undefined1 (*) [64])(*local_37c0 + 0x10);
    local_37c4 = local_37c4 + 4;
    local_1f10 = uVar23;
    uStack_1f08 = uVar24;
    _local_1e90 = auVar17;
    local_18c0 = local_1fe0._0_8_;
    uStack_18b8 = local_1fe0._8_8_;
    local_1890 = local_18a0;
    uStack_1888 = uStack_1898;
    local_1870 = uVar21;
    uStack_1868 = uVar22;
    local_3b0 = local_1fd0;
    uStack_3a8 = uStack_1fc8;
    local_328 = local_340;
    local_318 = local_330;
    local_310 = local_340;
    local_2f0 = local_340;
    local_2e8 = local_300;
    local_2d8 = local_340;
    local_2d0 = local_300;
    local_2c0 = local_340;
    local_2b8 = local_300;
    local_2a8 = local_340;
    local_2a0 = local_300;
    local_290 = local_340;
    local_288 = local_300;
  }
  for (; _local_1e90 = auVar17, local_37c4 < local_3514; local_37c4 = local_37c4 + 1) {
    fVar94 = expf(*(float *)*local_37c0 - local_35b4);
    *(float *)*local_37c0 = fVar94;
    local_37b4 = fVar94 + local_37b4;
    local_37c0 = (undefined1 (*) [64])(*local_37c0 + 4);
    auVar17 = _local_1e90;
  }
  if (local_3510 == 0x10) {
    auVar90 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    local_3780 = vdivps_avx512f(auVar90,local_3780);
  }
  if (local_3510 == 8) {
    local_20c0 = local_3780._0_4_;
    fStack_20bc = local_3780._4_4_;
    fStack_20b8 = local_3780._8_4_;
    fStack_20b4 = local_3780._12_4_;
    fStack_20b0 = local_3780._16_4_;
    fStack_20ac = local_3780._20_4_;
    fStack_20a8 = local_3780._24_4_;
    fStack_20a4 = local_3780._28_4_;
    local_2100 = local_3780._32_4_;
    fStack_20fc = local_3780._36_4_;
    fStack_20f8 = local_3780._40_4_;
    fStack_20f4 = local_3780._44_4_;
    fStack_20f0 = local_3780._48_4_;
    fStack_20ec = local_3780._52_4_;
    fStack_20e8 = local_3780._56_4_;
    fStack_20e4 = local_3780._60_4_;
    local_37a0._4_4_ = (float)uVar81 + fStack_20bc + fStack_20fc;
    local_37a0._0_4_ = (float)uVar80 + local_20c0 + local_2100;
    uStack_3798._0_4_ = fVar95 + fStack_20b8 + fStack_20f8;
    uStack_3798._4_4_ = fVar97 + fStack_20b4 + fStack_20f4;
    auStack_3790._0_4_ = fVar82 + fStack_20b0 + fStack_20f0;
    auStack_3790._4_4_ = fVar83 + fStack_20ac + fStack_20ec;
    uStack_3788._0_4_ = fVar84 + fStack_20a8 + fStack_20e8;
    uStack_3788._4_4_ = fVar85 + fStack_20a4 + fStack_20e4;
    auVar89 = _local_37a0;
    auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
    auVar16 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x20);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x30);
    uStack_17b0 = auVar16._0_8_;
    uStack_17a8 = auVar16._8_8_;
    uStack_3788 = auVar89._24_8_;
    auVar29._16_8_ = uStack_17b0;
    auVar29._0_16_ = auVar17;
    auVar29._24_8_ = uStack_17a8;
    auVar28._16_8_ = auStack_3790;
    auVar28._0_16_ = _local_37a0;
    auVar28._24_8_ = uStack_3788;
    _local_37a0 = vdivps_avx(auVar29,auVar28);
    local_3780 = vinsertf64x4_avx512f(ZEXT3264(_local_37a0),_local_37a0,1);
  }
  if (local_3510 == 4) {
    fStack_2110 = local_37a0._16_4_;
    fStack_210c = local_37a0._20_4_;
    fStack_2108 = local_37a0._24_4_;
    fStack_2104 = local_37a0._28_4_;
    fStack_2130 = local_3780._16_4_;
    fStack_212c = local_3780._20_4_;
    fStack_2128 = local_3780._24_4_;
    fStack_2124 = local_3780._28_4_;
    fStack_2170 = local_3780._48_4_;
    fStack_216c = local_3780._52_4_;
    fStack_2168 = local_3780._56_4_;
    fStack_2164 = local_3780._60_4_;
    local_1ee0 = (float)local_3920;
    fStack_1edc = (float)((ulong)local_3920 >> 0x20);
    fStack_1ed8 = (float)uStack_3918;
    fStack_1ed4 = (float)((ulong)uStack_3918 >> 0x20);
    local_37b0._4_4_ = (float)uVar87 + fStack_210c + fStack_212c + fStack_216c + fStack_1edc;
    local_37b0._0_4_ = (float)uVar86 + fStack_2110 + fStack_2130 + fStack_2170 + local_1ee0;
    uStack_37a8._0_4_ = fVar98 + fStack_2108 + fStack_2128 + fStack_2168 + fStack_1ed8;
    uStack_37a8._4_4_ = fVar99 + fStack_2104 + fStack_2124 + fStack_2164 + fStack_1ed4;
    auVar31._8_8_ = 0x3f8000003f800000;
    auVar31._0_8_ = 0x3f8000003f800000;
    auVar30._8_8_ = uStack_37a8;
    auVar30._0_8_ = local_37b0;
    _local_37b0 = vdivps_avx(auVar31,auVar30);
    _auStack_3790 = _local_37b0;
    _local_37a0 = _local_37b0;
    auVar26._16_8_ = local_37b0;
    auVar26._0_16_ = _local_37b0;
    auVar26._24_8_ = uStack_37a8;
    local_3780 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(uStack_37a8,CONCAT816(local_37b0,_local_37b0))),
                            auVar26,1);
  }
  if (local_3510 == 1) {
    auVar89 = vextractf64x4_avx512f(local_3780,1);
    fStack_1c70 = local_3780._16_4_;
    fStack_1c6c = local_3780._20_4_;
    fStack_1c68 = local_3780._24_4_;
    fStack_1c64 = local_3780._28_4_;
    fStack_1c90 = auVar89._16_4_;
    fStack_1c8c = auVar89._20_4_;
    fStack_1c88 = auVar89._24_4_;
    fStack_1c84 = auVar89._28_4_;
    fVar95 = fStack_1c70 + fStack_1c90 + local_1c30;
    fVar97 = fStack_1c6c + fStack_1c8c + fStack_1c2c;
    uVar21 = CONCAT44(fVar97,fVar95);
    uVar22 = CONCAT44(fStack_1c64 + fStack_1c84 + fStack_1c24,
                      fStack_1c68 + fStack_1c88 + fStack_1c28);
    auVar35._8_8_ = uVar22;
    auVar35._0_8_ = uVar21;
    auVar34._8_8_ = uVar22;
    auVar34._0_8_ = uVar21;
    auVar17 = vunpckhpd_avx(auVar34,auVar35);
    local_1c50 = auVar17._0_4_;
    fStack_1c4c = auVar17._4_4_;
    local_1b60 = local_37a0._16_4_;
    fStack_1b5c = local_37a0._20_4_;
    fStack_1b58 = local_37a0._24_4_;
    fStack_1b54 = local_37a0._28_4_;
    local_1b70 = local_37a0._0_4_;
    fStack_1b6c = local_37a0._4_4_;
    fStack_1b68 = local_37a0._8_4_;
    fStack_1b64 = local_37a0._12_4_;
    uVar21 = CONCAT44(fStack_1b5c + fStack_1b6c,local_1b60 + local_1b70);
    uVar22 = CONCAT44(fStack_1b54 + fStack_1b64,fStack_1b58 + fStack_1b68);
    auVar33._8_8_ = uVar22;
    auVar33._0_8_ = uVar21;
    auVar32._8_8_ = uVar22;
    auVar32._0_8_ = uVar21;
    auVar17 = vunpckhpd_avx(auVar32,auVar33);
    local_1b90 = auVar17._0_4_;
    fStack_1b8c = auVar17._4_4_;
    auVar17 = vunpckhpd_avx(_local_37b0,_local_37b0);
    local_1b10 = local_37b0._0_4_;
    fStack_1b0c = local_37b0._4_4_;
    local_1b20 = auVar17._0_4_;
    fStack_1b1c = auVar17._4_4_;
    local_37b4 = 1.0 / (local_37b4 + fVar95 + local_1c50 + fVar97 + fStack_1c4c +
                        local_1b60 + local_1b70 + local_1b90 +
                        fStack_1b5c + fStack_1b6c + fStack_1b8c +
                       local_1b10 + local_1b20 + fStack_1b0c + fStack_1b1c);
    local_37b0 = (undefined1  [8])CONCAT44(local_37b4,local_37b4);
    uStack_37a8 = CONCAT44(local_37b4,local_37b4);
    auStack_3790 = local_37b0;
    uStack_3788 = uStack_37a8;
    uStack_3798 = uStack_37a8;
    local_37a0 = local_37b0;
    auVar25._8_8_ = uStack_37a8;
    auVar25._0_8_ = local_37b0;
    auVar25._16_8_ = local_37b0;
    auVar25._24_8_ = uStack_37a8;
    local_3780 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(uStack_37a8,
                                               CONCAT816(local_37b0,CONCAT88(uStack_37a8,local_37b0)
                                                        ))),auVar25,1);
  }
  local_3928 = local_3508;
  for (local_392c = 0; local_392c + 0xf < local_3514; local_392c = local_392c + 0x10) {
    auVar90 = vmulps_avx512f(*local_3928,local_3780);
    local_3980 = auVar90._0_8_;
    uStack_3978 = auVar90._8_8_;
    uStack_3970 = auVar90._16_8_;
    uStack_3968 = auVar90._24_8_;
    uStack_3960 = auVar90._32_8_;
    uStack_3958 = auVar90._40_8_;
    uStack_3950 = auVar90._48_8_;
    uStack_3948 = auVar90._56_8_;
    *(undefined8 *)*local_3928 = local_3980;
    *(undefined8 *)(*local_3928 + 8) = uStack_3978;
    *(undefined8 *)(*local_3928 + 0x10) = uStack_3970;
    *(undefined8 *)(*local_3928 + 0x18) = uStack_3968;
    *(undefined8 *)(*local_3928 + 0x20) = uStack_3960;
    *(undefined8 *)(*local_3928 + 0x28) = uStack_3958;
    *(undefined8 *)(*local_3928 + 0x30) = uStack_3950;
    *(undefined8 *)(*local_3928 + 0x38) = uStack_3948;
    local_3928 = local_3928 + 1;
  }
  for (; local_392c + 7 < local_3514; local_392c = local_392c + 8) {
    local_18e0 = (float)*(undefined8 *)*local_3928;
    fStack_18dc = (float)((ulong)*(undefined8 *)*local_3928 >> 0x20);
    fStack_18d8 = (float)*(undefined8 *)(*local_3928 + 8);
    fStack_18d4 = (float)((ulong)*(undefined8 *)(*local_3928 + 8) >> 0x20);
    fStack_18d0 = (float)*(undefined8 *)(*local_3928 + 0x10);
    fStack_18cc = (float)((ulong)*(undefined8 *)(*local_3928 + 0x10) >> 0x20);
    fStack_18c8 = (float)*(undefined8 *)(*local_3928 + 0x18);
    uStack_18c4 = (undefined4)((ulong)*(undefined8 *)(*local_3928 + 0x18) >> 0x20);
    local_1900 = local_37a0._0_4_;
    fStack_18fc = local_37a0._4_4_;
    fStack_18f8 = local_37a0._8_4_;
    fStack_18f4 = local_37a0._12_4_;
    fStack_18f0 = local_37a0._16_4_;
    fStack_18ec = local_37a0._20_4_;
    fStack_18e8 = local_37a0._24_4_;
    local_39a0 = CONCAT44(fStack_18dc * fStack_18fc,local_18e0 * local_1900);
    uStack_3998 = CONCAT44(fStack_18d4 * fStack_18f4,fStack_18d8 * fStack_18f8);
    uStack_3990 = CONCAT44(fStack_18cc * fStack_18ec,fStack_18d0 * fStack_18f0);
    uStack_3988 = CONCAT44(uStack_18c4,fStack_18c8 * fStack_18e8);
    *(undefined8 *)*local_3928 = local_39a0;
    *(undefined8 *)(*local_3928 + 8) = uStack_3998;
    *(undefined8 *)(*local_3928 + 0x10) = uStack_3990;
    *(undefined8 *)(*local_3928 + 0x18) = uStack_3988;
    local_3928 = (undefined1 (*) [64])(*local_3928 + 0x20);
  }
  for (; local_392c + 3 < local_3514; local_392c = local_392c + 4) {
    local_1850 = (float)*(undefined8 *)*local_3928;
    fStack_184c = (float)((ulong)*(undefined8 *)*local_3928 >> 0x20);
    fStack_1848 = (float)*(undefined8 *)(*local_3928 + 8);
    fStack_1844 = (float)((ulong)*(undefined8 *)(*local_3928 + 8) >> 0x20);
    local_1860 = local_37b0._0_4_;
    fStack_185c = local_37b0._4_4_;
    fStack_1858 = local_37b0._8_4_;
    fStack_1854 = local_37b0._12_4_;
    local_39b0 = CONCAT44(fStack_184c * fStack_185c,local_1850 * local_1860);
    uStack_39a8 = CONCAT44(fStack_1844 * fStack_1854,fStack_1848 * fStack_1858);
    *(undefined8 *)*local_3928 = local_39b0;
    *(undefined8 *)(*local_3928 + 8) = uStack_39a8;
    local_3928 = (undefined1 (*) [64])(*local_3928 + 0x10);
  }
  for (; local_392c < local_3514; local_392c = local_392c + 1) {
    *(float *)*local_3928 = local_37b4 * *(float *)*local_3928;
    local_3928 = (undefined1 (*) [64])(*local_3928 + 4);
  }
  return;
}

Assistant:

static void softmax(float* _ptr, int elemcount, int elempack)
{
    const int size = elemcount * elempack;

    // reduce max
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _max_avx512 = _mm512_set1_ps(-FLT_MAX);
#endif // __AVX512F__
    __m256 _max_avx = _mm256_set1_ps(-FLT_MAX);
#endif // __AVX__
    __m128 _max = _mm_set1_ps(-FLT_MAX);
#endif // __SSE2__
    float max = -FLT_MAX;
    {
        const float* ptr = _ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _max_avx512 = _mm512_max_ps(_max_avx512, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _max_avx = _mm256_max_ps(_max_avx, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _max = _mm_max_ps(_max, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            max = std::max(max, *ptr++);
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 8)
    {
        {
            __m256 _max0 = _mm512_castps512_ps256(_max_avx512);
            __m256 _max1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_max_avx512), 1));
            _max_avx = _mm256_max_ps(_max_avx, _max0);
            _max_avx = _mm256_max_ps(_max_avx, _max1);
        }

        _max_avx512 = combine8x2_ps(_max_avx, _max_avx);
    }
#endif // __AVX512F__
    if (elempack == 4)
    {
#if __AVX512F__
        {
            __m256 _max0 = _mm512_castps512_ps256(_max_avx512);
            __m256 _max1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_max_avx512), 1));
            _max_avx = _mm256_max_ps(_max_avx, _max0);
            _max_avx = _mm256_max_ps(_max_avx, _max1);
        }
#endif // __AVX512F__
        {
            __m128 _max0 = _mm256_castps256_ps128(_max_avx);
            __m128 _max1 = _mm256_extractf128_ps(_max_avx, 1);
            _max = _mm_max_ps(_max, _max0);
            _max = _mm_max_ps(_max, _max1);
        }

        _max_avx = combine4x2_ps(_max, _max);
#if __AVX512F__
        _max_avx512 = combine8x2_ps(_max_avx, _max_avx);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 1)
    {
#if __AVX__
#if __AVX512F__
        max = std::max(max, _mm512_comp_reduce_max_ps(_max_avx512));
#endif // __AVX512F__
        max = std::max(max, _mm256_reduce_max_ps(_max_avx));
#endif // __AVX__
        max = std::max(max, _mm_reduce_max_ps(_max));

        _max = _mm_set1_ps(max);
#if __AVX__
        _max_avx = combine4x2_ps(_max, _max);
#if __AVX512F__
        _max_avx512 = combine8x2_ps(_max_avx, _max_avx);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__

    // reduce exp(x - max)
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _sum_avx512 = _mm512_set1_ps(0.f);
#endif // __AVX512F__
    __m256 _sum_avx = _mm256_set1_ps(0.f);
#endif // __AVX__
    __m128 _sum = _mm_set1_ps(0.f);
#endif // __SSE2__
    float sum = 0.f;
    {
        float* ptr = _ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_sub_ps(_p, _max_avx512);
            _p = exp512_ps(_p);
            _mm512_storeu_ps(ptr, _p);
            _sum_avx512 = _mm512_add_ps(_sum_avx512, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_sub_ps(_p, _max_avx);
            _p = exp256_ps(_p);
            _mm256_storeu_ps(ptr, _p);
            _sum_avx = _mm256_add_ps(_sum_avx, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = _mm_sub_ps(_p, _max);
            _p = exp_ps(_p);
            _mm_storeu_ps(ptr, _p);
            _sum = _mm_add_ps(_sum, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            float v = expf(*ptr - max);
            *ptr = v;
            sum += v;
            ptr++;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        _sum_avx512 = _mm512_div_ps(_mm512_set1_ps(1.f), _sum_avx512);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
#if __AVX512F__
        {
            __m256 _sum0 = _mm512_castps512_ps256(_sum_avx512);
            __m256 _sum1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_sum_avx512), 1));
            _sum_avx = _mm256_add_ps(_sum_avx, _sum0);
            _sum_avx = _mm256_add_ps(_sum_avx, _sum1);
        }
#endif // __AVX512F__

        _sum_avx = _mm256_div_ps(_mm256_set1_ps(1.f), _sum_avx);

#if __AVX512F__
        _sum_avx512 = combine8x2_ps(_sum_avx, _sum_avx);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 4)
    {
#if __AVX__
#if __AVX512F__
        {
            __m256 _sum0 = _mm512_castps512_ps256(_sum_avx512);
            __m256 _sum1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_sum_avx512), 1));
            _sum_avx = _mm256_add_ps(_sum_avx, _sum0);
            _sum_avx = _mm256_add_ps(_sum_avx, _sum1);
        }
#endif // __AVX512F__
        {
            __m128 _sum0 = _mm256_castps256_ps128(_sum_avx);
            __m128 _sum1 = _mm256_extractf128_ps(_sum_avx, 1);
            _sum = _mm_add_ps(_sum, _sum0);
            _sum = _mm_add_ps(_sum, _sum1);
        }
#endif // __AVX__

        _sum = _mm_div_ps(_mm_set1_ps(1.f), _sum);

#if __AVX__
        _sum_avx = combine4x2_ps(_sum, _sum);
#if __AVX512F__
        _sum_avx512 = combine8x2_ps(_sum_avx, _sum_avx);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__
    if (elempack == 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
        sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
        sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__

        sum = 1.f / sum;

#if __SSE2__
        _sum = _mm_set1_ps(sum);
#if __AVX__
        _sum_avx = combine4x2_ps(_sum, _sum);
#if __AVX512F__
        _sum_avx512 = combine8x2_ps(_sum_avx, _sum_avx);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__
    }

    // div sum
    {
        float* ptr = _ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_mul_ps(_p, _sum_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_mul_ps(_p, _sum_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = _mm_mul_ps(_p, _sum);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr++ *= sum;
        }
    }
}